

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [28];
  undefined1 auVar26 [28];
  undefined1 auVar27 [28];
  undefined1 auVar28 [28];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  byte bVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  int iVar117;
  undefined4 uVar118;
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  vfloat4 a0;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 ai;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  vint4 ai_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar165;
  __m128 a;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar183;
  float fVar190;
  vint4 ai_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar191;
  float fVar206;
  float fVar207;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar208;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  vfloat4 a0_3;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar225;
  float fVar234;
  float fVar235;
  vfloat4 b0_2;
  undefined1 auVar226 [16];
  float fVar236;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  vfloat4 a0_4;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  RTCFilterFunctionNArguments local_460;
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar38;
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  uint uVar116;
  float fVar142;
  float fVar149;
  float fVar150;
  float fVar164;
  float fVar166;
  float fVar182;
  undefined1 auVar262 [32];
  
  uVar37 = (ulong)(byte)prim[1];
  lVar40 = uVar37 * 0x25;
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 * 4 + 6)));
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 * 5 + 6)));
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 * 6 + 6)));
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 * 0xf + 6)));
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 * 0x11 + 6)));
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 * 0x1a + 6)));
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 * 0x1b + 6)));
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar37 * 0x1c + 6)));
  uVar118 = *(undefined4 *)(prim + lVar40 + 0x12);
  auVar263._4_4_ = uVar118;
  auVar263._0_4_ = uVar118;
  auVar263._8_4_ = uVar118;
  auVar263._12_4_ = uVar118;
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar98._16_16_ = in_YmmResult._16_16_;
  auVar48 = vsubps_avx512vl(auVar63,*(undefined1 (*) [16])(prim + lVar40 + 6));
  fVar165 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar40 + 0x16)) *
            *(float *)(prim + lVar40 + 0x1a);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar37 * 7 + 6);
  auVar69 = vpmovsxwd_avx(auVar63);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar37 * 0xb + 6);
  auVar70 = vpmovsxwd_avx(auVar66);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar37 * 9 + 6);
  auVar71 = vpmovsxwd_avx(auVar68);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar37 * 0xd + 6);
  auVar72 = vpmovsxwd_avx(auVar64);
  auVar49 = vpbroadcastd_avx512vl();
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar37 * 0x12 + 6);
  auVar50 = vpmovsxwd_avx512vl(auVar73);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar37 * 0x16 + 6);
  auVar51 = vpmovsxwd_avx512vl(auVar54);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar37 * 0x14 + 6);
  auVar52 = vpmovsxwd_avx512vl(auVar53);
  auVar63 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar63 = vinsertps_avx512f(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar53 = vmulps_avx512vl(auVar263,auVar48);
  auVar54 = vmulps_avx512vl(auVar263,auVar63);
  auVar55 = vcvtdq2ps_avx512vl(auVar55);
  auVar56 = vcvtdq2ps_avx512vl(auVar56);
  auVar57 = vcvtdq2ps_avx512vl(auVar57);
  auVar58 = vcvtdq2ps_avx512vl(auVar58);
  auVar59 = vcvtdq2ps_avx512vl(auVar59);
  auVar63 = vcvtdq2ps_avx(auVar60);
  auVar66 = vcvtdq2ps_avx(auVar61);
  auVar68 = vcvtdq2ps_avx(auVar62);
  auVar64 = vcvtdq2ps_avx(auVar65);
  uVar118 = auVar54._0_4_;
  auVar77._4_4_ = uVar118;
  auVar77._0_4_ = uVar118;
  auVar77._8_4_ = uVar118;
  auVar77._12_4_ = uVar118;
  auVar73 = vshufps_avx(auVar54,auVar54,0x55);
  auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar60 = vmulps_avx512vl(auVar54,auVar57);
  auVar75._0_4_ = auVar54._0_4_ * auVar63._0_4_;
  auVar75._4_4_ = auVar54._4_4_ * auVar63._4_4_;
  auVar75._8_4_ = auVar54._8_4_ * auVar63._8_4_;
  auVar75._12_4_ = auVar54._12_4_ * auVar63._12_4_;
  auVar74._0_4_ = auVar64._0_4_ * auVar54._0_4_;
  auVar74._4_4_ = auVar64._4_4_ * auVar54._4_4_;
  auVar74._8_4_ = auVar64._8_4_ * auVar54._8_4_;
  auVar74._12_4_ = auVar64._12_4_ * auVar54._12_4_;
  auVar54 = vfmadd231ps_avx512vl(auVar60,auVar73,auVar56);
  auVar60 = vfmadd231ps_avx512vl(auVar75,auVar73,auVar59);
  auVar73 = vfmadd231ps_fma(auVar74,auVar68,auVar73);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar77,auVar55);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar77,auVar58);
  auVar73 = vfmadd231ps_fma(auVar73,auVar66,auVar77);
  auVar61 = vbroadcastss_avx512vl(auVar53);
  auVar62 = vshufps_avx512vl(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx512vl(auVar53,auVar53,0xaa);
  auVar57 = vmulps_avx512vl(auVar53,auVar57);
  auVar63 = vmulps_avx512vl(auVar53,auVar63);
  auVar64 = vmulps_avx512vl(auVar53,auVar64);
  auVar53 = vfmadd231ps_avx512vl(auVar57,auVar62,auVar56);
  auVar56 = vfmadd231ps_avx512vl(auVar63,auVar62,auVar59);
  auVar63 = vfmadd231ps_fma(auVar64,auVar62,auVar68);
  auVar62 = vfmadd231ps_avx512vl(auVar53,auVar61,auVar55);
  auVar274 = ZEXT1664(auVar62);
  auVar65 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar58);
  auVar61 = vfmadd231ps_fma(auVar63,auVar61,auVar66);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar276 = ZEXT1664(auVar63);
  auVar66 = vandps_avx512vl(auVar54,auVar63);
  auVar240._8_4_ = 0x219392ef;
  auVar240._0_8_ = 0x219392ef219392ef;
  auVar240._12_4_ = 0x219392ef;
  uVar43 = vcmpps_avx512vl(auVar66,auVar240,1);
  bVar46 = (bool)((byte)uVar43 & 1);
  auVar48._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar54._0_4_;
  bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar54._4_4_;
  bVar46 = (bool)((byte)(uVar43 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar54._8_4_;
  bVar46 = (bool)((byte)(uVar43 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar54._12_4_;
  auVar66 = vandps_avx512vl(auVar60,auVar63);
  uVar43 = vcmpps_avx512vl(auVar66,auVar240,1);
  bVar46 = (bool)((byte)uVar43 & 1);
  auVar78._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar60._0_4_;
  bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar60._4_4_;
  bVar46 = (bool)((byte)(uVar43 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar60._8_4_;
  bVar46 = (bool)((byte)(uVar43 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar60._12_4_;
  auVar63 = vandps_avx512vl(auVar73,auVar63);
  uVar43 = vcmpps_avx512vl(auVar63,auVar240,1);
  bVar46 = (bool)((byte)uVar43 & 1);
  auVar67._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar73._0_4_;
  bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar73._4_4_;
  bVar46 = (bool)((byte)(uVar43 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar73._8_4_;
  bVar46 = (bool)((byte)(uVar43 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar73._12_4_;
  auVar63 = vrcp14ps_avx512vl(auVar48);
  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar277 = ZEXT1664(auVar66);
  auVar68 = vfnmadd213ps_avx512vl(auVar48,auVar63,auVar66);
  auVar68 = vfmadd132ps_fma(auVar68,auVar63,auVar63);
  auVar63 = vrcp14ps_avx512vl(auVar78);
  auVar64 = vfnmadd213ps_avx512vl(auVar78,auVar63,auVar66);
  auVar64 = vfmadd132ps_fma(auVar64,auVar63,auVar63);
  auVar63 = vrcp14ps_avx512vl(auVar67);
  auVar66 = vfnmadd213ps_avx512vl(auVar67,auVar63,auVar66);
  auVar73 = vfmadd132ps_fma(auVar66,auVar63,auVar63);
  auVar76._4_4_ = fVar165;
  auVar76._0_4_ = fVar165;
  auVar76._8_4_ = fVar165;
  auVar76._12_4_ = fVar165;
  auVar63 = vcvtdq2ps_avx(auVar69);
  auVar66 = vcvtdq2ps_avx(auVar70);
  auVar66 = vsubps_avx(auVar66,auVar63);
  auVar54 = vfmadd213ps_fma(auVar66,auVar76,auVar63);
  auVar63 = vcvtdq2ps_avx(auVar71);
  auVar66 = vcvtdq2ps_avx(auVar72);
  auVar66 = vsubps_avx(auVar66,auVar63);
  auVar53 = vfmadd213ps_fma(auVar66,auVar76,auVar63);
  auVar66 = vcvtdq2ps_avx512vl(auVar50);
  auVar63 = vcvtdq2ps_avx512vl(auVar51);
  auVar63 = vsubps_avx(auVar63,auVar66);
  auVar60 = vfmadd213ps_fma(auVar63,auVar76,auVar66);
  auVar66 = vcvtdq2ps_avx512vl(auVar52);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar37 * 0x18 + 6);
  auVar63 = vpmovsxwd_avx(auVar55);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,auVar66);
  auVar55 = vfmadd213ps_fma(auVar63,auVar76,auVar66);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar37 * 0x1d + 6);
  auVar63 = vpmovsxwd_avx(auVar56);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar37 * 0x21 + 6);
  auVar66 = vpmovsxwd_avx(auVar57);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar63);
  auVar56 = vfmadd213ps_fma(auVar66,auVar76,auVar63);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar37 * 0x1f + 6);
  auVar63 = vpmovsxwd_avx(auVar58);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar37 * 0x23 + 6);
  auVar66 = vpmovsxwd_avx(auVar59);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar63);
  auVar66 = vfmadd213ps_fma(auVar66,auVar76,auVar63);
  auVar63 = vsubps_avx512vl(auVar54,auVar62);
  auVar72._0_4_ = auVar68._0_4_ * auVar63._0_4_;
  auVar72._4_4_ = auVar68._4_4_ * auVar63._4_4_;
  auVar72._8_4_ = auVar68._8_4_ * auVar63._8_4_;
  auVar72._12_4_ = auVar68._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx512vl(auVar53,auVar62);
  auVar71._0_4_ = auVar68._0_4_ * auVar63._0_4_;
  auVar71._4_4_ = auVar68._4_4_ * auVar63._4_4_;
  auVar71._8_4_ = auVar68._8_4_ * auVar63._8_4_;
  auVar71._12_4_ = auVar68._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar60,auVar65);
  auVar51._0_4_ = auVar64._0_4_ * auVar63._0_4_;
  auVar51._4_4_ = auVar64._4_4_ * auVar63._4_4_;
  auVar51._8_4_ = auVar64._8_4_ * auVar63._8_4_;
  auVar51._12_4_ = auVar64._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar55,auVar65);
  auVar70._0_4_ = auVar64._0_4_ * auVar63._0_4_;
  auVar70._4_4_ = auVar64._4_4_ * auVar63._4_4_;
  auVar70._8_4_ = auVar64._8_4_ * auVar63._8_4_;
  auVar70._12_4_ = auVar64._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar56,auVar61);
  auVar52._0_4_ = auVar73._0_4_ * auVar63._0_4_;
  auVar52._4_4_ = auVar73._4_4_ * auVar63._4_4_;
  auVar52._8_4_ = auVar73._8_4_ * auVar63._8_4_;
  auVar52._12_4_ = auVar73._12_4_ * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar66,auVar61);
  auVar69._0_4_ = auVar73._0_4_ * auVar63._0_4_;
  auVar69._4_4_ = auVar73._4_4_ * auVar63._4_4_;
  auVar69._8_4_ = auVar73._8_4_ * auVar63._8_4_;
  auVar69._12_4_ = auVar73._12_4_ * auVar63._12_4_;
  auVar63 = vpminsd_avx(auVar72,auVar71);
  auVar66 = vpminsd_avx(auVar51,auVar70);
  auVar63 = vmaxps_avx(auVar63,auVar66);
  auVar66 = vpminsd_avx(auVar52,auVar69);
  uVar118 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar60._4_4_ = uVar118;
  auVar60._0_4_ = uVar118;
  auVar60._8_4_ = uVar118;
  auVar60._12_4_ = uVar118;
  auVar66 = vmaxps_avx512vl(auVar66,auVar60);
  auVar63 = vmaxps_avx(auVar63,auVar66);
  auVar61._8_4_ = 0x3f7ffffa;
  auVar61._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar61._12_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar63,auVar61);
  auVar63 = vpmaxsd_avx(auVar72,auVar71);
  auVar66 = vpmaxsd_avx(auVar51,auVar70);
  auVar63 = vminps_avx(auVar63,auVar66);
  auVar66 = vpmaxsd_avx(auVar52,auVar69);
  uVar118 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar62._4_4_ = uVar118;
  auVar62._0_4_ = uVar118;
  auVar62._8_4_ = uVar118;
  auVar62._12_4_ = uVar118;
  auVar66 = vminps_avx512vl(auVar66,auVar62);
  auVar63 = vminps_avx(auVar63,auVar66);
  auVar65._8_4_ = 0x3f800003;
  auVar65._0_8_ = 0x3f8000033f800003;
  auVar65._12_4_ = 0x3f800003;
  auVar63 = vmulps_avx512vl(auVar63,auVar65);
  uVar17 = vcmpps_avx512vl(local_400,auVar63,2);
  uVar18 = vpcmpgtd_avx512vl(auVar49,_DAT_01f4ad30);
  uVar43 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar17 & 0xf & (byte)uVar18));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar63 = vpxord_avx512vl(auVar50,auVar50);
  auVar271 = ZEXT1664(auVar63);
  auVar98._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar279 = ZEXT1664(auVar98._0_16_);
LAB_018f9362:
  if (uVar43 == 0) {
    return;
  }
  lVar40 = 0;
  for (uVar37 = uVar43; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
    lVar40 = lVar40 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  fVar165 = (pGVar8->time_range).lower;
  fVar225 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar165) / ((pGVar8->time_range).upper - fVar165));
  auVar63 = vroundss_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),9);
  uVar7 = *(uint *)(prim + lVar40 * 4 + 6);
  auVar79._16_16_ = auVar98._16_16_;
  auVar66 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar63 = vminss_avx(auVar63,auVar66);
  auVar65 = vmaxss_avx512f(auVar271._0_16_,auVar63);
  uVar37 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar41 = (long)(int)auVar65._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar41);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar41);
  auVar63 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar37);
  lVar40 = uVar37 + 1;
  auVar66 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar40);
  lVar1 = uVar37 + 2;
  auVar68 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar37 + 3;
  auVar64 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar41);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar41);
  auVar73 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar37);
  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar40);
  auVar53 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar41);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar41);
  auVar56 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar37);
  auVar57 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar40);
  auVar58 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar59 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar41);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar41);
  auVar60 = *(undefined1 (*) [16])(lVar11 + uVar37 * lVar10);
  auVar61 = *(undefined1 (*) [16])(lVar11 + lVar40 * lVar10);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  fVar225 = fVar225 - auVar65._0_4_;
  auVar79._0_16_ = vxorps_avx512vl(auVar274._0_16_,auVar274._0_16_);
  auVar65 = vmulps_avx512vl(auVar64,auVar79._0_16_);
  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar70 = vfmadd213ps_avx512vl(auVar69,auVar68,auVar65);
  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar66,auVar71);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar63,auVar69);
  auVar52 = auVar279._0_16_;
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar68,auVar52);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar66,auVar79._0_16_);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar63,auVar52);
  auVar72 = vmulps_avx512vl(auVar55,auVar79._0_16_);
  auVar48 = vfmadd213ps_avx512vl(auVar69,auVar53,auVar72);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar54,auVar71);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar73,auVar69);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar53,auVar52);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar54,auVar79._0_16_);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar73,auVar52);
  auVar49 = vmulps_avx512vl(auVar64,auVar69);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar68,auVar71);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar66,auVar69);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar63,auVar79._0_16_);
  auVar64 = vmulps_avx512vl(auVar64,auVar52);
  auVar68 = vfmadd231ps_avx512vl(auVar64,auVar79._0_16_,auVar68);
  auVar66 = vfnmadd231ps_avx512vl(auVar68,auVar52,auVar66);
  auVar50 = vfnmadd231ps_avx512vl(auVar66,auVar79._0_16_,auVar63);
  auVar63 = vmulps_avx512vl(auVar55,auVar69);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar53,auVar71);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar54,auVar69);
  auVar51 = vfmadd231ps_avx512vl(auVar63,auVar73,auVar79._0_16_);
  auVar63 = vmulps_avx512vl(auVar55,auVar52);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar79._0_16_,auVar53);
  auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar52,auVar54);
  auVar54 = vfnmadd231ps_avx512vl(auVar63,auVar79._0_16_,auVar73);
  auVar66 = vshufps_avx512vl(auVar65,auVar65,0xc9);
  auVar63 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar63 = vmulps_avx512vl(auVar65,auVar63);
  auVar63 = vfmsub231ps_avx512vl(auVar63,auVar66,auVar48);
  auVar68 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar63 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar63 = vmulps_avx512vl(auVar65,auVar63);
  auVar63 = vfmsub231ps_fma(auVar63,auVar66,auVar72);
  auVar64 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar63 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar66 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar167._0_4_ = auVar50._0_4_ * auVar66._0_4_;
  auVar167._4_4_ = auVar50._4_4_ * auVar66._4_4_;
  auVar167._8_4_ = auVar50._8_4_ * auVar66._8_4_;
  auVar167._12_4_ = auVar50._12_4_ * auVar66._12_4_;
  auVar66 = vfmsub231ps_fma(auVar167,auVar63,auVar51);
  auVar73 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar66 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar168._0_4_ = auVar50._0_4_ * auVar66._0_4_;
  auVar168._4_4_ = auVar50._4_4_ * auVar66._4_4_;
  auVar168._8_4_ = auVar50._8_4_ * auVar66._8_4_;
  auVar168._12_4_ = auVar50._12_4_ * auVar66._12_4_;
  auVar63 = vfmsub231ps_fma(auVar168,auVar63,auVar54);
  auVar54 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar63 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar94._4_28_ = auVar79._4_28_;
  auVar94._0_4_ = auVar63._0_4_;
  auVar66 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar94._0_16_);
  auVar53 = vmulss_avx512f(auVar66,ZEXT416(0x3fc00000));
  auVar55 = vmulss_avx512f(auVar63,ZEXT416(0xbf000000));
  auVar55 = vmulss_avx512f(auVar55,auVar66);
  auVar66 = vmulss_avx512f(auVar55,ZEXT416((uint)(auVar66._0_4_ * auVar66._0_4_)));
  fVar165 = auVar53._0_4_ + auVar66._0_4_;
  auVar192._4_4_ = fVar165;
  auVar192._0_4_ = fVar165;
  auVar192._8_4_ = fVar165;
  auVar192._12_4_ = fVar165;
  auVar66 = vdpps_avx(auVar68,auVar64,0x7f);
  auVar53 = vmulps_avx512vl(auVar68,auVar192);
  auVar55 = vbroadcastss_avx512vl(auVar63);
  auVar64 = vmulps_avx512vl(auVar55,auVar64);
  fVar239 = auVar66._0_4_;
  auVar151._0_4_ = fVar239 * auVar68._0_4_;
  auVar151._4_4_ = fVar239 * auVar68._4_4_;
  auVar151._8_4_ = fVar239 * auVar68._8_4_;
  auVar151._12_4_ = fVar239 * auVar68._12_4_;
  auVar68 = vsubps_avx(auVar64,auVar151);
  auVar66 = vrcp14ss_avx512f(auVar79._0_16_,auVar94._0_16_);
  auVar63 = vfnmadd213ss_avx512f(auVar63,auVar66,ZEXT416(0x40000000));
  fVar234 = auVar66._0_4_ * auVar63._0_4_;
  auVar63 = vdpps_avx(auVar73,auVar73,0x7f);
  auVar80._16_16_ = auVar79._16_16_;
  auVar80._0_16_ = auVar79._0_16_;
  auVar97._4_28_ = auVar80._4_28_;
  auVar97._0_4_ = auVar63._0_4_;
  auVar66 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar97._0_16_);
  auVar64 = vmulss_avx512f(auVar66,ZEXT416(0x3fc00000));
  auVar55 = vmulss_avx512f(auVar63,ZEXT416(0xbf000000));
  fVar239 = auVar66._0_4_;
  fVar239 = auVar64._0_4_ + auVar55._0_4_ * fVar239 * fVar239 * fVar239;
  auVar193._0_4_ = auVar73._0_4_ * fVar239;
  auVar193._4_4_ = auVar73._4_4_ * fVar239;
  auVar193._8_4_ = auVar73._8_4_ * fVar239;
  auVar193._12_4_ = auVar73._12_4_ * fVar239;
  auVar66 = vdpps_avx(auVar73,auVar54,0x7f);
  auVar64 = vbroadcastss_avx512vl(auVar63);
  auVar64 = vmulps_avx512vl(auVar64,auVar54);
  fVar235 = auVar66._0_4_;
  auVar125._0_4_ = fVar235 * auVar73._0_4_;
  auVar125._4_4_ = fVar235 * auVar73._4_4_;
  auVar125._8_4_ = fVar235 * auVar73._8_4_;
  auVar125._12_4_ = fVar235 * auVar73._12_4_;
  auVar66 = vsubps_avx(auVar64,auVar125);
  auVar64 = vrcp14ss_avx512f(auVar79._0_16_,auVar97._0_16_);
  auVar63 = vfnmadd213ss_avx512f(auVar63,auVar64,ZEXT416(0x40000000));
  fVar235 = auVar64._0_4_ * auVar63._0_4_;
  auVar63 = vshufps_avx512vl(auVar70,auVar70,0xff);
  auVar64 = vmulps_avx512vl(auVar63,auVar53);
  auVar72 = vsubps_avx512vl(auVar70,auVar64);
  auVar73 = vshufps_avx512vl(auVar65,auVar65,0xff);
  auVar73 = vmulps_avx512vl(auVar73,auVar53);
  auVar143._0_4_ = auVar73._0_4_ + auVar63._0_4_ * fVar165 * fVar234 * auVar68._0_4_;
  auVar143._4_4_ = auVar73._4_4_ + auVar63._4_4_ * fVar165 * fVar234 * auVar68._4_4_;
  auVar143._8_4_ = auVar73._8_4_ + auVar63._8_4_ * fVar165 * fVar234 * auVar68._8_4_;
  auVar143._12_4_ = auVar73._12_4_ + auVar63._12_4_ * fVar165 * fVar234 * auVar68._12_4_;
  auVar68 = vsubps_avx512vl(auVar65,auVar143);
  auVar70 = vaddps_avx512vl(auVar70,auVar64);
  auVar64 = vaddps_avx512vl(auVar65,auVar143);
  auVar63 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar73 = vmulps_avx512vl(auVar63,auVar193);
  auVar65 = vsubps_avx512vl(auVar49,auVar73);
  auVar54 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar54 = vmulps_avx512vl(auVar54,auVar193);
  auVar194._0_4_ = auVar54._0_4_ + auVar63._0_4_ * fVar239 * auVar66._0_4_ * fVar235;
  auVar194._4_4_ = auVar54._4_4_ + auVar63._4_4_ * fVar239 * auVar66._4_4_ * fVar235;
  auVar194._8_4_ = auVar54._8_4_ + auVar63._8_4_ * fVar239 * auVar66._8_4_ * fVar235;
  auVar194._12_4_ = auVar54._12_4_ + auVar63._12_4_ * fVar239 * auVar66._12_4_ * fVar235;
  auVar63 = vsubps_avx(auVar50,auVar194);
  auVar48 = vaddps_avx512vl(auVar49,auVar73);
  auVar66 = vaddps_avx512vl(auVar50,auVar194);
  auVar50._8_4_ = 0x3eaaaaab;
  auVar50._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar50._12_4_ = 0x3eaaaaab;
  auVar184._0_4_ = auVar72._0_4_ + auVar68._0_4_ * 0.33333334;
  auVar184._4_4_ = auVar72._4_4_ + auVar68._4_4_ * 0.33333334;
  auVar184._8_4_ = auVar72._8_4_ + auVar68._8_4_ * 0.33333334;
  auVar184._12_4_ = auVar72._12_4_ + auVar68._12_4_ * 0.33333334;
  auVar169._0_4_ = auVar63._0_4_ * 0.33333334;
  auVar169._4_4_ = auVar63._4_4_ * 0.33333334;
  auVar169._8_4_ = auVar63._8_4_ * 0.33333334;
  auVar169._12_4_ = auVar63._12_4_ * 0.33333334;
  auVar53 = vsubps_avx(auVar65,auVar169);
  local_520._4_4_ = auVar70._4_4_ + auVar64._4_4_ * 0.33333334;
  local_520._0_4_ = auVar70._0_4_ + auVar64._0_4_ * 0.33333334;
  fStack_518 = auVar70._8_4_ + auVar64._8_4_ * 0.33333334;
  fStack_514 = auVar70._12_4_ + auVar64._12_4_ * 0.33333334;
  auVar63 = vmulps_avx512vl(auVar66,auVar50);
  auVar55 = vsubps_avx(auVar48,auVar63);
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar66 = vmulps_avx512vl(auVar59,auVar79._0_16_);
  auVar68 = vfmadd213ps_avx512vl(auVar69,auVar58,auVar66);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar57,auVar71);
  auVar49 = vfmadd231ps_avx512vl(auVar68,auVar56,auVar69);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar58,auVar52);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar57,auVar79._0_16_);
  auVar50 = vfnmadd231ps_avx512vl(auVar66,auVar56,auVar52);
  auVar66 = vmulps_avx512vl(auVar63,auVar79._0_16_);
  auVar68 = vfmadd213ps_avx512vl(auVar69,auVar62,auVar66);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar61,auVar71);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar60,auVar69);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar62,auVar52);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar61,auVar79._0_16_);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar60,auVar52);
  auVar64 = vmulps_avx512vl(auVar59,auVar69);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar58,auVar71);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar57,auVar69);
  auVar51 = vfmadd231ps_avx512vl(auVar64,auVar56,auVar79._0_16_);
  auVar64 = vmulps_avx512vl(auVar59,auVar52);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar79._0_16_,auVar58);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar52,auVar57);
  auVar56 = vfnmadd231ps_avx512vl(auVar64,auVar79._0_16_,auVar56);
  auVar64 = vmulps_avx512vl(auVar63,auVar69);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar62,auVar71);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar61,auVar69);
  auVar73 = vfmadd231ps_avx512vl(auVar64,auVar60,auVar79._0_16_);
  auVar63 = vmulps_avx512vl(auVar63,auVar52);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar79._0_16_,auVar62);
  auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar52,auVar61);
  auVar54 = vfnmadd231ps_avx512vl(auVar63,auVar79._0_16_,auVar60);
  auVar63 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar64 = vshufps_avx512vl(auVar68,auVar68,0xc9);
  fVar235 = auVar50._0_4_;
  auVar241._0_4_ = fVar235 * auVar64._0_4_;
  fVar142 = auVar50._4_4_;
  auVar241._4_4_ = fVar142 * auVar64._4_4_;
  fVar149 = auVar50._8_4_;
  auVar241._8_4_ = fVar149 * auVar64._8_4_;
  fVar150 = auVar50._12_4_;
  auVar241._12_4_ = fVar150 * auVar64._12_4_;
  auVar68 = vfmsub231ps_avx512vl(auVar241,auVar63,auVar68);
  auVar68 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar64 = vshufps_avx512vl(auVar66,auVar66,0xc9);
  auVar251._0_4_ = fVar235 * auVar64._0_4_;
  auVar251._4_4_ = fVar142 * auVar64._4_4_;
  auVar251._8_4_ = fVar149 * auVar64._8_4_;
  auVar251._12_4_ = fVar150 * auVar64._12_4_;
  auVar63 = vfmsub231ps_avx512vl(auVar251,auVar63,auVar66);
  auVar64 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar57 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  auVar63 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar63 = vmulps_avx512vl(auVar56,auVar63);
  auVar63 = vfmsub231ps_fma(auVar63,auVar57,auVar73);
  auVar73 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar66 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar63 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar66 = vmulps_avx512vl(auVar56,auVar66);
  auVar66 = vfmsub231ps_fma(auVar66,auVar57,auVar54);
  auVar54 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar82._16_16_ = auVar79._16_16_;
  auVar82._0_16_ = auVar79._0_16_;
  auVar81._4_28_ = auVar82._4_28_;
  auVar81._0_4_ = auVar63._0_4_;
  auVar66 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar81._0_16_);
  auVar57 = vmulss_avx512f(auVar66,ZEXT416(0x3fc00000));
  auVar58 = vmulss_avx512f(auVar63,ZEXT416(0xbf000000));
  auVar58 = vmulss_avx512f(auVar58,auVar66);
  auVar66 = vmulss_avx512f(auVar58,ZEXT416((uint)(auVar66._0_4_ * auVar66._0_4_)));
  auVar66 = vaddss_avx512f(auVar57,auVar66);
  auVar264._0_4_ = auVar66._0_4_;
  auVar264._4_4_ = auVar264._0_4_;
  auVar264._8_4_ = auVar264._0_4_;
  auVar264._12_4_ = auVar264._0_4_;
  auVar57 = vmulps_avx512vl(auVar68,auVar264);
  auVar66 = vdpps_avx(auVar68,auVar64,0x7f);
  auVar58 = vbroadcastss_avx512vl(auVar63);
  auVar64 = vmulps_avx512vl(auVar58,auVar64);
  fVar165 = auVar66._0_4_;
  auVar170._0_4_ = auVar68._0_4_ * fVar165;
  auVar170._4_4_ = auVar68._4_4_ * fVar165;
  auVar170._8_4_ = auVar68._8_4_ * fVar165;
  auVar170._12_4_ = auVar68._12_4_ * fVar165;
  auVar68 = vsubps_avx(auVar64,auVar170);
  auVar66 = vrcp14ss_avx512f(auVar79._0_16_,auVar81._0_16_);
  auVar63 = vfnmadd213ss_avx512f(auVar63,auVar66,ZEXT416(0x40000000));
  fVar239 = auVar66._0_4_ * auVar63._0_4_;
  auVar63 = vdpps_avx(auVar73,auVar73,0x7f);
  auVar84._16_16_ = auVar79._16_16_;
  auVar84._0_16_ = auVar79._0_16_;
  auVar83._4_28_ = auVar84._4_28_;
  auVar83._0_4_ = auVar63._0_4_;
  auVar66 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar83._0_16_);
  auVar64 = vmulss_avx512f(auVar66,ZEXT416(0x3fc00000));
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar58 = vmulss_avx512f(auVar63,ZEXT416(0xbf000000));
  auVar278 = ZEXT464(0x3f800000);
  fVar165 = auVar66._0_4_;
  fVar165 = auVar64._0_4_ + auVar58._0_4_ * fVar165 * fVar165 * fVar165;
  auVar257._0_4_ = auVar73._0_4_ * fVar165;
  auVar257._4_4_ = auVar73._4_4_ * fVar165;
  auVar257._8_4_ = auVar73._8_4_ * fVar165;
  auVar257._12_4_ = auVar73._12_4_ * fVar165;
  auVar66 = vdpps_avx(auVar73,auVar54,0x7f);
  auVar64 = vbroadcastss_avx512vl(auVar63);
  auVar64 = vmulps_avx512vl(auVar64,auVar54);
  fVar234 = auVar66._0_4_;
  auVar218._0_4_ = fVar234 * auVar73._0_4_;
  auVar218._4_4_ = fVar234 * auVar73._4_4_;
  auVar218._8_4_ = fVar234 * auVar73._8_4_;
  auVar218._12_4_ = fVar234 * auVar73._12_4_;
  auVar66 = vsubps_avx(auVar64,auVar218);
  auVar64 = vrcp14ss_avx512f(auVar79._0_16_,auVar83._0_16_);
  auVar63 = vfnmadd213ss_avx512f(auVar63,auVar64,ZEXT416(0x40000000));
  fVar234 = auVar63._0_4_ * auVar64._0_4_;
  auVar64 = vshufps_avx512vl(auVar49,auVar49,0xff);
  auVar73 = vmulps_avx512vl(auVar64,auVar57);
  auVar54 = vsubps_avx512vl(auVar49,auVar73);
  auVar63 = vshufps_avx(auVar50,auVar50,0xff);
  auVar63 = vmulps_avx512vl(auVar63,auVar57);
  auVar152._0_4_ = auVar63._0_4_ + auVar64._0_4_ * auVar264._0_4_ * fVar239 * auVar68._0_4_;
  auVar152._4_4_ = auVar63._4_4_ + auVar64._4_4_ * auVar264._0_4_ * fVar239 * auVar68._4_4_;
  auVar152._8_4_ = auVar63._8_4_ + auVar64._8_4_ * auVar264._0_4_ * fVar239 * auVar68._8_4_;
  auVar152._12_4_ = auVar63._12_4_ + auVar64._12_4_ * auVar264._0_4_ * fVar239 * auVar68._12_4_;
  auVar63 = vsubps_avx(auVar50,auVar152);
  auVar68 = vaddps_avx512vl(auVar49,auVar73);
  auVar64 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar252._0_4_ = auVar64._0_4_ * auVar257._0_4_;
  auVar252._4_4_ = auVar64._4_4_ * auVar257._4_4_;
  auVar252._8_4_ = auVar64._8_4_ * auVar257._8_4_;
  auVar252._12_4_ = auVar64._12_4_ * auVar257._12_4_;
  auVar73 = vsubps_avx512vl(auVar51,auVar252);
  auVar57 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar57 = vmulps_avx512vl(auVar57,auVar257);
  auVar171._0_4_ = auVar57._0_4_ + auVar64._0_4_ * fVar165 * auVar66._0_4_ * fVar234;
  auVar171._4_4_ = auVar57._4_4_ + auVar64._4_4_ * fVar165 * auVar66._4_4_ * fVar234;
  auVar171._8_4_ = auVar57._8_4_ + auVar64._8_4_ * fVar165 * auVar66._8_4_ * fVar234;
  auVar171._12_4_ = auVar57._12_4_ + auVar64._12_4_ * fVar165 * auVar66._12_4_ * fVar234;
  auVar66 = vsubps_avx512vl(auVar56,auVar171);
  auVar64 = vaddps_avx512vl(auVar51,auVar252);
  auVar56 = vaddps_avx512vl(auVar56,auVar171);
  auVar219._0_4_ = auVar54._0_4_ + auVar63._0_4_ * 0.33333334;
  auVar219._4_4_ = auVar54._4_4_ + auVar63._4_4_ * 0.33333334;
  auVar219._8_4_ = auVar54._8_4_ + auVar63._8_4_ * 0.33333334;
  auVar219._12_4_ = auVar54._12_4_ + auVar63._12_4_ * 0.33333334;
  auVar209._0_4_ = auVar66._0_4_ * 0.33333334;
  auVar209._4_4_ = auVar66._4_4_ * 0.33333334;
  auVar209._8_4_ = auVar66._8_4_ * 0.33333334;
  auVar209._12_4_ = auVar66._12_4_ * 0.33333334;
  auVar63 = vsubps_avx(auVar73,auVar209);
  auVar153._0_4_ = auVar68._0_4_ + (fVar235 + auVar152._0_4_) * 0.33333334;
  auVar153._4_4_ = auVar68._4_4_ + (fVar142 + auVar152._4_4_) * 0.33333334;
  auVar153._8_4_ = auVar68._8_4_ + (fVar149 + auVar152._8_4_) * 0.33333334;
  auVar153._12_4_ = auVar68._12_4_ + (fVar150 + auVar152._12_4_) * 0.33333334;
  auVar172._0_4_ = auVar56._0_4_ * 0.33333334;
  auVar172._4_4_ = auVar56._4_4_ * 0.33333334;
  auVar172._8_4_ = auVar56._8_4_ * 0.33333334;
  auVar172._12_4_ = auVar56._12_4_ * 0.33333334;
  auVar66 = vsubps_avx(auVar64,auVar172);
  auVar258._4_4_ = fVar225;
  auVar258._0_4_ = fVar225;
  auVar258._8_4_ = fVar225;
  auVar258._12_4_ = fVar225;
  auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar225));
  auVar119._0_4_ = auVar56._0_4_;
  auVar119._4_4_ = auVar119._0_4_;
  auVar119._8_4_ = auVar119._0_4_;
  auVar119._12_4_ = auVar119._0_4_;
  auVar54 = vmulps_avx512vl(auVar258,auVar54);
  auVar56 = vmulps_avx512vl(auVar258,auVar219);
  auVar63 = vmulps_avx512vl(auVar258,auVar63);
  auVar265._0_4_ = fVar225 * auVar73._0_4_;
  auVar265._4_4_ = fVar225 * auVar73._4_4_;
  auVar265._8_4_ = fVar225 * auVar73._8_4_;
  auVar265._12_4_ = fVar225 * auVar73._12_4_;
  local_340 = vfmadd231ps_avx512vl(auVar54,auVar119,auVar72);
  local_350 = vfmadd231ps_avx512vl(auVar56,auVar119,auVar184);
  local_360 = vfmadd231ps_avx512vl(auVar63,auVar119,auVar53);
  local_370 = vfmadd231ps_fma(auVar265,auVar119,auVar65);
  auVar63 = vmulps_avx512vl(auVar258,auVar68);
  auVar68 = vmulps_avx512vl(auVar258,auVar153);
  auVar66 = vmulps_avx512vl(auVar258,auVar66);
  auVar253._0_4_ = fVar225 * auVar64._0_4_;
  auVar253._4_4_ = fVar225 * auVar64._4_4_;
  auVar253._8_4_ = fVar225 * auVar64._8_4_;
  auVar253._12_4_ = fVar225 * auVar64._12_4_;
  _local_380 = vfmadd231ps_avx512vl(auVar63,auVar119,auVar70);
  _local_390 = vfmadd231ps_avx512vl(auVar68,auVar119,_local_520);
  _local_3a0 = vfmadd231ps_avx512vl(auVar66,auVar119,auVar55);
  _local_3b0 = vfmadd231ps_fma(auVar253,auVar119,auVar48);
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar165 = *(float *)(ray + k * 4 + 0x60);
  local_2c0 = vsubps_avx512vl(local_340,auVar63);
  uVar118 = local_2c0._0_4_;
  auVar126._4_4_ = uVar118;
  auVar126._0_4_ = uVar118;
  auVar126._8_4_ = uVar118;
  auVar126._12_4_ = uVar118;
  auVar66 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar68 = vshufps_avx(local_2c0,local_2c0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar239 = pre->ray_space[k].vz.field_0.m128[0];
  fVar225 = pre->ray_space[k].vz.field_0.m128[1];
  fVar234 = pre->ray_space[k].vz.field_0.m128[2];
  fVar235 = pre->ray_space[k].vz.field_0.m128[3];
  auVar120._0_4_ = fVar239 * auVar68._0_4_;
  auVar120._4_4_ = fVar225 * auVar68._4_4_;
  auVar120._8_4_ = fVar234 * auVar68._8_4_;
  auVar120._12_4_ = fVar235 * auVar68._12_4_;
  auVar66 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar5,auVar66);
  auVar53 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar126);
  local_2d0 = vsubps_avx512vl(local_350,auVar63);
  uVar118 = local_2d0._0_4_;
  auVar130._4_4_ = uVar118;
  auVar130._0_4_ = uVar118;
  auVar130._8_4_ = uVar118;
  auVar130._12_4_ = uVar118;
  auVar66 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar68 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar127._0_4_ = fVar239 * auVar68._0_4_;
  auVar127._4_4_ = fVar225 * auVar68._4_4_;
  auVar127._8_4_ = fVar234 * auVar68._8_4_;
  auVar127._12_4_ = fVar235 * auVar68._12_4_;
  auVar66 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar5,auVar66);
  auVar55 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar130);
  local_2e0 = vsubps_avx512vl(local_360,auVar63);
  uVar118 = local_2e0._0_4_;
  auVar173._4_4_ = uVar118;
  auVar173._0_4_ = uVar118;
  auVar173._8_4_ = uVar118;
  auVar173._12_4_ = uVar118;
  auVar66 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar68 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar131._0_4_ = fVar239 * auVar68._0_4_;
  auVar131._4_4_ = fVar225 * auVar68._4_4_;
  auVar131._8_4_ = fVar234 * auVar68._8_4_;
  auVar131._12_4_ = fVar235 * auVar68._12_4_;
  auVar66 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar5,auVar66);
  auVar56 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar173);
  local_2f0 = vsubps_avx(local_370,auVar63);
  uVar118 = local_2f0._0_4_;
  auVar195._4_4_ = uVar118;
  auVar195._0_4_ = uVar118;
  auVar195._8_4_ = uVar118;
  auVar195._12_4_ = uVar118;
  auVar66 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar68 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar174._0_4_ = fVar239 * auVar68._0_4_;
  auVar174._4_4_ = fVar225 * auVar68._4_4_;
  auVar174._8_4_ = fVar234 * auVar68._8_4_;
  auVar174._12_4_ = fVar235 * auVar68._12_4_;
  auVar66 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar66);
  auVar57 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar195);
  local_300 = vsubps_avx512vl(_local_380,auVar63);
  uVar118 = local_300._0_4_;
  auVar196._4_4_ = uVar118;
  auVar196._0_4_ = uVar118;
  auVar196._8_4_ = uVar118;
  auVar196._12_4_ = uVar118;
  auVar66 = vshufps_avx(local_300,local_300,0x55);
  auVar68 = vshufps_avx(local_300,local_300,0xaa);
  auVar220._0_4_ = auVar68._0_4_ * fVar239;
  auVar220._4_4_ = auVar68._4_4_ * fVar225;
  auVar220._8_4_ = auVar68._8_4_ * fVar234;
  auVar220._12_4_ = auVar68._12_4_ * fVar235;
  auVar66 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar66);
  auVar58 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar196);
  local_310 = vsubps_avx512vl(_local_390,auVar63);
  uVar118 = local_310._0_4_;
  auVar197._4_4_ = uVar118;
  auVar197._0_4_ = uVar118;
  auVar197._8_4_ = uVar118;
  auVar197._12_4_ = uVar118;
  auVar66 = vshufps_avx(local_310,local_310,0x55);
  auVar68 = vshufps_avx(local_310,local_310,0xaa);
  auVar226._0_4_ = auVar68._0_4_ * fVar239;
  auVar226._4_4_ = auVar68._4_4_ * fVar225;
  auVar226._8_4_ = auVar68._8_4_ * fVar234;
  auVar226._12_4_ = auVar68._12_4_ * fVar235;
  auVar66 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar66);
  auVar59 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar197);
  local_320 = vsubps_avx512vl(_local_3a0,auVar63);
  uVar118 = local_320._0_4_;
  auVar198._4_4_ = uVar118;
  auVar198._0_4_ = uVar118;
  auVar198._8_4_ = uVar118;
  auVar198._12_4_ = uVar118;
  auVar66 = vshufps_avx(local_320,local_320,0x55);
  auVar68 = vshufps_avx(local_320,local_320,0xaa);
  auVar242._0_4_ = auVar68._0_4_ * fVar239;
  auVar242._4_4_ = auVar68._4_4_ * fVar225;
  auVar242._8_4_ = auVar68._8_4_ * fVar234;
  auVar242._12_4_ = auVar68._12_4_ * fVar235;
  auVar66 = vfmadd231ps_fma(auVar242,(undefined1  [16])aVar5,auVar66);
  auVar60 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar198);
  local_330 = vsubps_avx(_local_3b0,auVar63);
  uVar118 = local_330._0_4_;
  auVar144._4_4_ = uVar118;
  auVar144._0_4_ = uVar118;
  auVar144._8_4_ = uVar118;
  auVar144._12_4_ = uVar118;
  auVar63 = vshufps_avx(local_330,local_330,0x55);
  auVar66 = vshufps_avx(local_330,local_330,0xaa);
  auVar185._0_4_ = auVar66._0_4_ * fVar239;
  auVar185._4_4_ = auVar66._4_4_ * fVar225;
  auVar185._8_4_ = auVar66._8_4_ * fVar234;
  auVar185._12_4_ = auVar66._12_4_ * fVar235;
  auVar63 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar63);
  auVar61 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar144);
  auVar68 = vmovlhps_avx(auVar53,auVar58);
  auVar64 = vmovlhps_avx(auVar55,auVar59);
  auVar73 = vmovlhps_avx(auVar56,auVar60);
  _local_2a0 = vmovlhps_avx512f(auVar57,auVar61);
  auVar66 = vminps_avx(auVar68,auVar64);
  auVar63 = vmaxps_avx(auVar68,auVar64);
  auVar54 = vminps_avx512vl(auVar73,_local_2a0);
  auVar66 = vminps_avx(auVar66,auVar54);
  auVar54 = vmaxps_avx512vl(auVar73,_local_2a0);
  auVar63 = vmaxps_avx(auVar63,auVar54);
  auVar54 = vshufpd_avx(auVar66,auVar66,3);
  auVar66 = vminps_avx(auVar66,auVar54);
  auVar54 = vshufpd_avx(auVar63,auVar63,3);
  auVar63 = vmaxps_avx(auVar63,auVar54);
  auVar66 = vandps_avx512vl(auVar66,auVar276._0_16_);
  auVar63 = vandps_avx512vl(auVar63,auVar276._0_16_);
  auVar63 = vmaxps_avx(auVar66,auVar63);
  auVar66 = vmovshdup_avx(auVar63);
  auVar63 = vmaxss_avx(auVar66,auVar63);
  fVar239 = auVar63._0_4_ * 9.536743e-07;
  auVar66 = vmovddup_avx512vl(auVar53);
  auVar54 = vmovddup_avx512vl(auVar55);
  auVar53 = vmovddup_avx512vl(auVar56);
  auVar55 = vmovddup_avx512vl(auVar57);
  local_2b0 = ZEXT416((uint)fVar239);
  auVar128._4_4_ = fVar239;
  auVar128._0_4_ = fVar239;
  auVar128._8_4_ = fVar239;
  auVar128._12_4_ = fVar239;
  local_260._16_4_ = fVar239;
  local_260._0_16_ = auVar128;
  local_260._20_4_ = fVar239;
  local_260._24_4_ = fVar239;
  local_260._28_4_ = fVar239;
  auVar63 = vxorps_avx512vl(auVar128,auVar62);
  local_1c0 = auVar63._0_4_;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  uVar37 = 0;
  local_270 = vsubps_avx(auVar64,auVar68);
  local_280 = vsubps_avx(auVar73,auVar64);
  local_290 = vsubps_avx512vl(_local_2a0,auVar73);
  local_3c0 = vsubps_avx512vl(_local_380,local_340);
  local_3d0 = vsubps_avx512vl(_local_390,local_350);
  local_3e0 = vsubps_avx512vl(_local_3a0,local_360);
  _local_3f0 = vsubps_avx(_local_3b0,local_370);
  local_1e0 = vpbroadcastd_avx512vl();
  local_200 = vpbroadcastd_avx512vl();
  auVar63 = ZEXT816(0x3f80000000000000);
  auVar49 = auVar63;
LAB_018f9ec2:
  do {
    auVar56 = vshufps_avx(auVar49,auVar49,0x50);
    auVar259._8_4_ = 0x3f800000;
    auVar259._0_8_ = 0x3f8000003f800000;
    auVar259._12_4_ = 0x3f800000;
    auVar262._16_4_ = 0x3f800000;
    auVar262._0_16_ = auVar259;
    auVar262._20_4_ = 0x3f800000;
    auVar262._24_4_ = 0x3f800000;
    auVar262._28_4_ = 0x3f800000;
    auVar57 = vsubps_avx(auVar259,auVar56);
    fVar239 = auVar56._0_4_;
    fVar142 = auVar58._0_4_;
    auVar145._0_4_ = fVar142 * fVar239;
    fVar225 = auVar56._4_4_;
    fVar149 = auVar58._4_4_;
    auVar145._4_4_ = fVar149 * fVar225;
    fVar234 = auVar56._8_4_;
    auVar145._8_4_ = fVar142 * fVar234;
    fVar235 = auVar56._12_4_;
    auVar145._12_4_ = fVar149 * fVar235;
    fVar150 = auVar59._0_4_;
    auVar154._0_4_ = fVar150 * fVar239;
    fVar164 = auVar59._4_4_;
    auVar154._4_4_ = fVar164 * fVar225;
    auVar154._8_4_ = fVar150 * fVar234;
    auVar154._12_4_ = fVar164 * fVar235;
    fVar166 = auVar60._0_4_;
    auVar175._0_4_ = fVar166 * fVar239;
    fVar182 = auVar60._4_4_;
    auVar175._4_4_ = fVar182 * fVar225;
    auVar175._8_4_ = fVar166 * fVar234;
    auVar175._12_4_ = fVar182 * fVar235;
    fVar183 = auVar61._0_4_;
    auVar132._0_4_ = fVar183 * fVar239;
    fVar190 = auVar61._4_4_;
    auVar132._4_4_ = fVar190 * fVar225;
    auVar132._8_4_ = fVar183 * fVar234;
    auVar132._12_4_ = fVar190 * fVar235;
    auVar62 = vfmadd231ps_avx512vl(auVar145,auVar57,auVar66);
    auVar65 = vfmadd231ps_avx512vl(auVar154,auVar57,auVar54);
    auVar69 = vfmadd231ps_avx512vl(auVar175,auVar57,auVar53);
    auVar57 = vfmadd231ps_avx512vl(auVar132,auVar55,auVar57);
    auVar56 = vmovshdup_avx(auVar63);
    fVar225 = auVar63._0_4_;
    fVar239 = (auVar56._0_4_ - fVar225) * 0.04761905;
    auVar160._4_4_ = fVar225;
    auVar160._0_4_ = fVar225;
    auVar160._8_4_ = fVar225;
    auVar160._12_4_ = fVar225;
    auVar160._16_4_ = fVar225;
    auVar160._20_4_ = fVar225;
    auVar160._24_4_ = fVar225;
    auVar160._28_4_ = fVar225;
    auVar89._0_8_ = auVar56._0_8_;
    auVar89._8_8_ = auVar89._0_8_;
    auVar89._16_8_ = auVar89._0_8_;
    auVar89._24_8_ = auVar89._0_8_;
    auVar98 = vsubps_avx(auVar89,auVar160);
    uVar118 = auVar62._0_4_;
    auVar141._4_4_ = uVar118;
    auVar141._0_4_ = uVar118;
    auVar141._8_4_ = uVar118;
    auVar141._12_4_ = uVar118;
    auVar141._16_4_ = uVar118;
    auVar141._20_4_ = uVar118;
    auVar141._24_4_ = uVar118;
    auVar141._28_4_ = uVar118;
    auVar90._8_4_ = 1;
    auVar90._0_8_ = 0x100000001;
    auVar90._12_4_ = 1;
    auVar90._16_4_ = 1;
    auVar90._20_4_ = 1;
    auVar90._24_4_ = 1;
    auVar90._28_4_ = 1;
    auVar97 = ZEXT1632(auVar62);
    auVar94 = vpermps_avx2(auVar90,auVar97);
    auVar79 = vbroadcastss_avx512vl(auVar65);
    auVar95 = ZEXT1632(auVar65);
    auVar80 = vpermps_avx512vl(auVar90,auVar95);
    auVar81 = vbroadcastss_avx512vl(auVar69);
    auVar96 = ZEXT1632(auVar69);
    auVar82 = vpermps_avx512vl(auVar90,auVar96);
    auVar83 = vbroadcastss_avx512vl(auVar57);
    auVar93 = ZEXT1632(auVar57);
    auVar84 = vpermps_avx512vl(auVar90,auVar93);
    auVar223._4_4_ = fVar239;
    auVar223._0_4_ = fVar239;
    auVar223._8_4_ = fVar239;
    auVar223._12_4_ = fVar239;
    auVar223._16_4_ = fVar239;
    auVar223._20_4_ = fVar239;
    auVar223._24_4_ = fVar239;
    auVar223._28_4_ = fVar239;
    auVar91._8_4_ = 2;
    auVar91._0_8_ = 0x200000002;
    auVar91._12_4_ = 2;
    auVar91._16_4_ = 2;
    auVar91._20_4_ = 2;
    auVar91._24_4_ = 2;
    auVar91._28_4_ = 2;
    auVar85 = vpermps_avx512vl(auVar91,auVar97);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar87 = vpermps_avx512vl(auVar86,auVar97);
    auVar88 = vpermps_avx512vl(auVar91,auVar95);
    auVar89 = vpermps_avx512vl(auVar86,auVar95);
    auVar97 = vpermps_avx2(auVar91,auVar96);
    auVar90 = vpermps_avx512vl(auVar86,auVar96);
    auVar91 = vpermps_avx512vl(auVar91,auVar93);
    auVar92 = vpermps_avx512vl(auVar86,auVar93);
    auVar56 = vfmadd132ps_fma(auVar98,auVar160,_DAT_01f7b040);
    auVar98 = vsubps_avx(auVar262,ZEXT1632(auVar56));
    auVar86 = vmulps_avx512vl(auVar79,ZEXT1632(auVar56));
    auVar95 = ZEXT1632(auVar56);
    auVar93 = vmulps_avx512vl(auVar80,auVar95);
    auVar57 = vfmadd231ps_fma(auVar86,auVar98,auVar141);
    auVar62 = vfmadd231ps_fma(auVar93,auVar98,auVar94);
    auVar86 = vmulps_avx512vl(auVar81,auVar95);
    auVar93 = vmulps_avx512vl(auVar82,auVar95);
    auVar79 = vfmadd231ps_avx512vl(auVar86,auVar98,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar80);
    auVar86 = vmulps_avx512vl(auVar83,auVar95);
    auVar141 = ZEXT1632(auVar56);
    auVar84 = vmulps_avx512vl(auVar84,auVar141);
    auVar81 = vfmadd231ps_avx512vl(auVar86,auVar98,auVar81);
    auVar82 = vfmadd231ps_avx512vl(auVar84,auVar98,auVar82);
    fVar234 = auVar56._0_4_;
    fVar235 = auVar56._4_4_;
    auVar86._4_4_ = fVar235 * auVar79._4_4_;
    auVar86._0_4_ = fVar234 * auVar79._0_4_;
    fVar236 = auVar56._8_4_;
    auVar86._8_4_ = fVar236 * auVar79._8_4_;
    fVar237 = auVar56._12_4_;
    auVar86._12_4_ = fVar237 * auVar79._12_4_;
    auVar86._16_4_ = auVar79._16_4_ * 0.0;
    auVar86._20_4_ = auVar79._20_4_ * 0.0;
    auVar86._24_4_ = auVar79._24_4_ * 0.0;
    auVar86._28_4_ = fVar225;
    auVar93._4_4_ = fVar235 * auVar80._4_4_;
    auVar93._0_4_ = fVar234 * auVar80._0_4_;
    auVar93._8_4_ = fVar236 * auVar80._8_4_;
    auVar93._12_4_ = fVar237 * auVar80._12_4_;
    auVar93._16_4_ = auVar80._16_4_ * 0.0;
    auVar93._20_4_ = auVar80._20_4_ * 0.0;
    auVar93._24_4_ = auVar80._24_4_ * 0.0;
    auVar93._28_4_ = auVar94._28_4_;
    auVar57 = vfmadd231ps_fma(auVar86,auVar98,ZEXT1632(auVar57));
    auVar62 = vfmadd231ps_fma(auVar93,auVar98,ZEXT1632(auVar62));
    auVar99._0_4_ = fVar234 * auVar81._0_4_;
    auVar99._4_4_ = fVar235 * auVar81._4_4_;
    auVar99._8_4_ = fVar236 * auVar81._8_4_;
    auVar99._12_4_ = fVar237 * auVar81._12_4_;
    auVar99._16_4_ = auVar81._16_4_ * 0.0;
    auVar99._20_4_ = auVar81._20_4_ * 0.0;
    auVar99._24_4_ = auVar81._24_4_ * 0.0;
    auVar99._28_4_ = 0;
    auVar95._4_4_ = fVar235 * auVar82._4_4_;
    auVar95._0_4_ = fVar234 * auVar82._0_4_;
    auVar95._8_4_ = fVar236 * auVar82._8_4_;
    auVar95._12_4_ = fVar237 * auVar82._12_4_;
    auVar95._16_4_ = auVar82._16_4_ * 0.0;
    auVar95._20_4_ = auVar82._20_4_ * 0.0;
    auVar95._24_4_ = auVar82._24_4_ * 0.0;
    auVar95._28_4_ = auVar81._28_4_;
    auVar65 = vfmadd231ps_fma(auVar99,auVar98,auVar79);
    auVar69 = vfmadd231ps_fma(auVar95,auVar98,auVar80);
    auVar96._28_4_ = auVar80._28_4_;
    auVar96._0_28_ =
         ZEXT1628(CONCAT412(fVar237 * auVar69._12_4_,
                            CONCAT48(fVar236 * auVar69._8_4_,
                                     CONCAT44(fVar235 * auVar69._4_4_,fVar234 * auVar69._0_4_))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar237 * auVar65._12_4_,
                                                 CONCAT48(fVar236 * auVar65._8_4_,
                                                          CONCAT44(fVar235 * auVar65._4_4_,
                                                                   fVar234 * auVar65._0_4_)))),
                              auVar98,ZEXT1632(auVar57));
    auVar71 = vfmadd231ps_fma(auVar96,auVar98,ZEXT1632(auVar62));
    auVar94 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar57));
    auVar79 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar62));
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar94 = vmulps_avx512vl(auVar94,auVar80);
    auVar79 = vmulps_avx512vl(auVar79,auVar80);
    auVar217._0_4_ = fVar239 * auVar94._0_4_;
    auVar217._4_4_ = fVar239 * auVar94._4_4_;
    auVar217._8_4_ = fVar239 * auVar94._8_4_;
    auVar217._12_4_ = fVar239 * auVar94._12_4_;
    auVar217._16_4_ = fVar239 * auVar94._16_4_;
    auVar217._20_4_ = fVar239 * auVar94._20_4_;
    auVar217._24_4_ = fVar239 * auVar94._24_4_;
    auVar217._28_4_ = 0;
    auVar94 = vmulps_avx512vl(auVar223,auVar79);
    auVar62 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar70),_DAT_01fb9fc0,ZEXT1632(auVar62));
    auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_01fb9fc0,ZEXT1632(auVar62));
    auVar135._0_4_ = auVar217._0_4_ + auVar70._0_4_;
    auVar135._4_4_ = auVar217._4_4_ + auVar70._4_4_;
    auVar135._8_4_ = auVar217._8_4_ + auVar70._8_4_;
    auVar135._12_4_ = auVar217._12_4_ + auVar70._12_4_;
    auVar135._16_4_ = auVar217._16_4_ + 0.0;
    auVar135._20_4_ = auVar217._20_4_ + 0.0;
    auVar135._24_4_ = auVar217._24_4_ + 0.0;
    auVar135._28_4_ = 0;
    auVar99 = ZEXT1632(auVar62);
    auVar82 = vpermt2ps_avx512vl(auVar217,_DAT_01fb9fc0,auVar99);
    auVar83 = vaddps_avx512vl(ZEXT1632(auVar71),auVar94);
    auVar84 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,auVar99);
    auVar94 = vsubps_avx(auVar79,auVar82);
    auVar82 = vsubps_avx512vl(auVar81,auVar84);
    auVar84 = vmulps_avx512vl(auVar88,auVar141);
    auVar86 = vmulps_avx512vl(auVar89,auVar141);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar98,auVar85);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,auVar87);
    auVar93 = vmulps_avx512vl(auVar97,auVar141);
    auVar95 = vmulps_avx512vl(auVar90,auVar141);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar88);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar89);
    auVar96 = vmulps_avx512vl(auVar91,auVar141);
    auVar85 = vmulps_avx512vl(auVar92,auVar141);
    auVar57 = vfmadd231ps_fma(auVar96,auVar98,auVar97);
    auVar97 = vfmadd231ps_avx512vl(auVar85,auVar98,auVar90);
    auVar96 = vmulps_avx512vl(auVar141,auVar93);
    auVar87 = ZEXT1632(auVar56);
    auVar85 = vmulps_avx512vl(auVar87,auVar95);
    auVar84 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar84);
    auVar86 = vfmadd231ps_avx512vl(auVar85,auVar98,auVar86);
    auVar97 = vmulps_avx512vl(auVar87,auVar97);
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar237 * auVar57._12_4_,
                                            CONCAT48(fVar236 * auVar57._8_4_,
                                                     CONCAT44(fVar235 * auVar57._4_4_,
                                                              fVar234 * auVar57._0_4_)))),auVar98,
                         auVar93);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar98,auVar95);
    auVar85._4_4_ = fVar235 * auVar93._4_4_;
    auVar85._0_4_ = fVar234 * auVar93._0_4_;
    auVar85._8_4_ = fVar236 * auVar93._8_4_;
    auVar85._12_4_ = fVar237 * auVar93._12_4_;
    auVar85._16_4_ = auVar93._16_4_ * 0.0;
    auVar85._20_4_ = auVar93._20_4_ * 0.0;
    auVar85._24_4_ = auVar93._24_4_ * 0.0;
    auVar85._28_4_ = auVar90._28_4_;
    auVar95 = vmulps_avx512vl(auVar87,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar85,auVar98,auVar84);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar86,auVar98);
    auVar98 = vsubps_avx512vl(auVar93,auVar84);
    auVar97 = vsubps_avx512vl(auVar97,auVar86);
    auVar98 = vmulps_avx512vl(auVar98,auVar80);
    auVar97 = vmulps_avx512vl(auVar97,auVar80);
    fVar225 = fVar239 * auVar98._0_4_;
    fVar234 = fVar239 * auVar98._4_4_;
    auVar87._4_4_ = fVar234;
    auVar87._0_4_ = fVar225;
    fVar235 = fVar239 * auVar98._8_4_;
    auVar87._8_4_ = fVar235;
    fVar236 = fVar239 * auVar98._12_4_;
    auVar87._12_4_ = fVar236;
    fVar237 = fVar239 * auVar98._16_4_;
    auVar87._16_4_ = fVar237;
    fVar238 = fVar239 * auVar98._20_4_;
    auVar87._20_4_ = fVar238;
    fVar239 = fVar239 * auVar98._24_4_;
    auVar87._24_4_ = fVar239;
    auVar87._28_4_ = auVar98._28_4_;
    auVar97 = vmulps_avx512vl(auVar223,auVar97);
    auVar80 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,auVar99);
    auVar84 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar99);
    auVar224._0_4_ = auVar96._0_4_ + fVar225;
    auVar224._4_4_ = auVar96._4_4_ + fVar234;
    auVar224._8_4_ = auVar96._8_4_ + fVar235;
    auVar224._12_4_ = auVar96._12_4_ + fVar236;
    auVar224._16_4_ = auVar96._16_4_ + fVar237;
    auVar224._20_4_ = auVar96._20_4_ + fVar238;
    auVar224._24_4_ = auVar96._24_4_ + fVar239;
    auVar224._28_4_ = auVar96._28_4_ + auVar98._28_4_;
    auVar98 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,ZEXT1632(auVar62));
    auVar86 = vaddps_avx512vl(auVar95,auVar97);
    auVar97 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,ZEXT1632(auVar62));
    auVar98 = vsubps_avx(auVar80,auVar98);
    auVar97 = vsubps_avx512vl(auVar84,auVar97);
    auVar141 = ZEXT1632(auVar70);
    auVar93 = vsubps_avx512vl(auVar96,auVar141);
    auVar160 = ZEXT1632(auVar71);
    auVar85 = vsubps_avx512vl(auVar95,auVar160);
    auVar87 = vsubps_avx512vl(auVar80,auVar79);
    auVar93 = vaddps_avx512vl(auVar93,auVar87);
    auVar87 = vsubps_avx512vl(auVar84,auVar81);
    auVar85 = vaddps_avx512vl(auVar85,auVar87);
    auVar87 = vmulps_avx512vl(auVar160,auVar93);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar141,auVar85);
    auVar88 = vmulps_avx512vl(auVar83,auVar93);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar135,auVar85);
    auVar89 = vmulps_avx512vl(auVar82,auVar93);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar94,auVar85);
    auVar90 = vmulps_avx512vl(auVar81,auVar93);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar79,auVar85);
    auVar91 = vmulps_avx512vl(auVar95,auVar93);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar96,auVar85);
    auVar92 = vmulps_avx512vl(auVar86,auVar93);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar224,auVar85);
    auVar99 = vmulps_avx512vl(auVar97,auVar93);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar98,auVar85);
    auVar93 = vmulps_avx512vl(auVar84,auVar93);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar80,auVar85);
    auVar85 = vminps_avx512vl(auVar87,auVar88);
    auVar87 = vmaxps_avx512vl(auVar87,auVar88);
    auVar88 = vminps_avx512vl(auVar89,auVar90);
    auVar85 = vminps_avx512vl(auVar85,auVar88);
    auVar88 = vmaxps_avx512vl(auVar89,auVar90);
    auVar87 = vmaxps_avx512vl(auVar87,auVar88);
    auVar88 = vminps_avx512vl(auVar91,auVar92);
    auVar89 = vmaxps_avx512vl(auVar91,auVar92);
    auVar90 = vminps_avx512vl(auVar99,auVar93);
    auVar88 = vminps_avx512vl(auVar88,auVar90);
    auVar85 = vminps_avx512vl(auVar85,auVar88);
    auVar93 = vmaxps_avx512vl(auVar99,auVar93);
    auVar93 = vmaxps_avx512vl(auVar89,auVar93);
    auVar93 = vmaxps_avx512vl(auVar87,auVar93);
    auVar56 = auVar93._0_16_;
    uVar17 = vcmpps_avx512vl(auVar85,local_260,2);
    auVar88._4_4_ = uStack_1bc;
    auVar88._0_4_ = local_1c0;
    auVar88._8_4_ = uStack_1b8;
    auVar88._12_4_ = uStack_1b4;
    auVar88._16_4_ = uStack_1b0;
    auVar88._20_4_ = uStack_1ac;
    auVar88._24_4_ = uStack_1a8;
    auVar88._28_4_ = uStack_1a4;
    uVar18 = vcmpps_avx512vl(auVar93,auVar88,5);
    bVar35 = (byte)uVar17 & (byte)uVar18 & 0x7f;
    if (bVar35 != 0) {
      auVar93 = vsubps_avx512vl(auVar79,auVar141);
      auVar85 = vsubps_avx512vl(auVar81,auVar160);
      auVar87 = vsubps_avx512vl(auVar80,auVar96);
      auVar93 = vaddps_avx512vl(auVar93,auVar87);
      auVar56 = auVar93._0_16_;
      auVar87 = vsubps_avx512vl(auVar84,auVar95);
      auVar85 = vaddps_avx512vl(auVar85,auVar87);
      auVar87 = vmulps_avx512vl(auVar160,auVar93);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar85,auVar141);
      auVar83 = vmulps_avx512vl(auVar83,auVar93);
      auVar83 = vfnmadd213ps_avx512vl(auVar135,auVar85,auVar83);
      auVar82 = vmulps_avx512vl(auVar82,auVar93);
      auVar82 = vfnmadd213ps_avx512vl(auVar94,auVar85,auVar82);
      auVar94 = vmulps_avx512vl(auVar81,auVar93);
      auVar81 = vfnmadd231ps_avx512vl(auVar94,auVar85,auVar79);
      auVar94 = vmulps_avx512vl(auVar95,auVar93);
      auVar95 = vfnmadd231ps_avx512vl(auVar94,auVar85,auVar96);
      auVar94 = vmulps_avx512vl(auVar86,auVar93);
      auVar86 = vfnmadd213ps_avx512vl(auVar224,auVar85,auVar94);
      auVar94 = vmulps_avx512vl(auVar97,auVar93);
      auVar96 = vfnmadd213ps_avx512vl(auVar98,auVar85,auVar94);
      auVar98 = vmulps_avx512vl(auVar84,auVar93);
      auVar84 = vfnmadd231ps_avx512vl(auVar98,auVar80,auVar85);
      auVar94 = vminps_avx(auVar87,auVar83);
      auVar98 = vmaxps_avx(auVar87,auVar83);
      auVar79 = vminps_avx(auVar82,auVar81);
      auVar79 = vminps_avx(auVar94,auVar79);
      auVar94 = vmaxps_avx(auVar82,auVar81);
      auVar98 = vmaxps_avx(auVar98,auVar94);
      auVar97 = vminps_avx(auVar95,auVar86);
      auVar94 = vmaxps_avx(auVar95,auVar86);
      auVar80 = vminps_avx(auVar96,auVar84);
      auVar97 = vminps_avx(auVar97,auVar80);
      auVar97 = vminps_avx(auVar79,auVar97);
      auVar79 = vmaxps_avx(auVar96,auVar84);
      auVar94 = vmaxps_avx(auVar94,auVar79);
      auVar98 = vmaxps_avx(auVar98,auVar94);
      uVar17 = vcmpps_avx512vl(auVar98,auVar88,5);
      uVar18 = vcmpps_avx512vl(auVar97,local_260,2);
      bVar35 = bVar35 & (byte)uVar17 & (byte)uVar18;
      if (bVar35 != 0) {
        auStack_430[uVar37] = (uint)bVar35;
        uVar17 = vmovlps_avx(auVar63);
        (&uStack_240)[uVar37] = uVar17;
        uVar3 = vmovlps_avx(auVar49);
        auStack_1a0[uVar37] = uVar3;
        uVar37 = (ulong)((int)uVar37 + 1);
      }
    }
    auVar63 = vxorps_avx512vl(auVar56,auVar56);
    auVar271 = ZEXT1664(auVar63);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar279 = ZEXT1664(auVar63);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar272 = ZEXT3264(auVar98);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar273 = ZEXT1664(auVar63);
    auVar274 = ZEXT464(0x3a83126f);
    auVar275 = ZEXT3264(_DAT_01fb9fe0);
    auVar98 = _DAT_01fb9fe0;
LAB_018fa3c0:
    do {
      do {
        do {
          auVar57 = auVar277._0_16_;
          auVar56 = auVar271._0_16_;
          if ((int)uVar37 == 0) {
            uVar118 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar24._4_4_ = uVar118;
            auVar24._0_4_ = uVar118;
            auVar24._8_4_ = uVar118;
            auVar24._12_4_ = uVar118;
            uVar17 = vcmpps_avx512vl(local_400,auVar24,2);
            uVar43 = (ulong)((uint)uVar43 & (uint)uVar43 + 0xf & (uint)uVar17);
            goto LAB_018f9362;
          }
          uVar36 = (int)uVar37 - 1;
          uVar38 = (ulong)uVar36;
          uVar116 = auStack_430[uVar38];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = auStack_1a0[uVar38];
          uVar3 = 0;
          for (uVar42 = (ulong)uVar116; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000
              ) {
            uVar3 = uVar3 + 1;
          }
          uVar39 = uVar116 - 1 & uVar116;
          bVar46 = uVar39 == 0;
          auStack_430[uVar38] = uVar39;
          if (bVar46) {
            uVar37 = (ulong)uVar36;
          }
          auVar121._8_8_ = 0;
          auVar121._0_8_ = uVar3;
          auVar63 = vpunpcklqdq_avx(auVar121,ZEXT416((int)uVar3 + 1));
          auVar63 = vcvtqq2ps_avx512vl(auVar63);
          auVar63 = vmulps_avx512vl(auVar63,auVar273._0_16_);
          uVar118 = *(undefined4 *)((long)&uStack_240 + uVar38 * 8 + 4);
          auVar19._4_4_ = uVar118;
          auVar19._0_4_ = uVar118;
          auVar19._8_4_ = uVar118;
          auVar19._12_4_ = uVar118;
          auVar62 = vmulps_avx512vl(auVar63,auVar19);
          auVar63 = vsubps_avx512vl(auVar57,auVar63);
          uVar118 = *(undefined4 *)(&uStack_240 + uVar38);
          auVar20._4_4_ = uVar118;
          auVar20._0_4_ = uVar118;
          auVar20._8_4_ = uVar118;
          auVar20._12_4_ = uVar118;
          auVar63 = vfmadd231ps_avx512vl(auVar62,auVar63,auVar20);
          auVar62 = vmovshdup_avx(auVar63);
          fVar239 = auVar62._0_4_ - auVar63._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar239));
          if (uVar116 == 0 || bVar46) goto LAB_018f9ec2;
          auVar62 = vshufps_avx(auVar49,auVar49,0x50);
          auVar65 = vucomiss_avx512f(ZEXT416((uint)fVar239));
          auVar274 = ZEXT1664(auVar65);
          auVar70 = vsubps_avx512vl(auVar57,auVar62);
          fVar225 = auVar62._0_4_;
          auVar155._0_4_ = fVar225 * fVar142;
          fVar234 = auVar62._4_4_;
          auVar155._4_4_ = fVar234 * fVar149;
          fVar235 = auVar62._8_4_;
          auVar155._8_4_ = fVar235 * fVar142;
          fVar236 = auVar62._12_4_;
          auVar155._12_4_ = fVar236 * fVar149;
          auVar176._0_4_ = fVar225 * fVar150;
          auVar176._4_4_ = fVar234 * fVar164;
          auVar176._8_4_ = fVar235 * fVar150;
          auVar176._12_4_ = fVar236 * fVar164;
          auVar186._0_4_ = fVar225 * fVar166;
          auVar186._4_4_ = fVar234 * fVar182;
          auVar186._8_4_ = fVar235 * fVar166;
          auVar186._12_4_ = fVar236 * fVar182;
          auVar136._0_4_ = fVar225 * fVar183;
          auVar136._4_4_ = fVar234 * fVar190;
          auVar136._8_4_ = fVar235 * fVar183;
          auVar136._12_4_ = fVar236 * fVar190;
          auVar62 = vfmadd231ps_fma(auVar155,auVar70,auVar66);
          auVar65 = vfmadd231ps_fma(auVar176,auVar70,auVar54);
          auVar69 = vfmadd231ps_fma(auVar186,auVar70,auVar53);
          auVar70 = vfmadd231ps_fma(auVar136,auVar70,auVar55);
          auVar92._16_16_ = auVar62;
          auVar92._0_16_ = auVar62;
          auVar161._16_16_ = auVar65;
          auVar161._0_16_ = auVar65;
          auVar181._16_16_ = auVar69;
          auVar181._0_16_ = auVar69;
          auVar94 = vpermps_avx512vl(auVar275._0_32_,ZEXT1632(auVar63));
          auVar98 = vsubps_avx(auVar161,auVar92);
          auVar65 = vfmadd213ps_fma(auVar98,auVar94,auVar92);
          auVar98 = vsubps_avx(auVar181,auVar161);
          auVar71 = vfmadd213ps_fma(auVar98,auVar94,auVar161);
          auVar62 = vsubps_avx(auVar70,auVar69);
          auVar162._16_16_ = auVar62;
          auVar162._0_16_ = auVar62;
          auVar62 = vfmadd213ps_fma(auVar162,auVar94,auVar181);
          auVar98 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar65));
          auVar65 = vfmadd213ps_fma(auVar98,auVar94,ZEXT1632(auVar65));
          auVar98 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar71));
          auVar62 = vfmadd213ps_fma(auVar98,auVar94,ZEXT1632(auVar71));
          auVar98 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar65));
          auVar67 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar98,auVar94);
          auVar98 = vmulps_avx512vl(auVar98,auVar272._0_32_);
          auVar62 = vmulss_avx512f(ZEXT416((uint)fVar239),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar225 = auVar62._0_4_;
          auVar187._0_8_ =
               CONCAT44(auVar67._4_4_ + fVar225 * auVar98._4_4_,
                        auVar67._0_4_ + fVar225 * auVar98._0_4_);
          auVar187._8_4_ = auVar67._8_4_ + fVar225 * auVar98._8_4_;
          auVar187._12_4_ = auVar67._12_4_ + fVar225 * auVar98._12_4_;
          auVar156._0_4_ = fVar225 * auVar98._16_4_;
          auVar156._4_4_ = fVar225 * auVar98._20_4_;
          auVar156._8_4_ = fVar225 * auVar98._24_4_;
          auVar156._12_4_ = fVar225 * auVar98._28_4_;
          auVar51 = vsubps_avx((undefined1  [16])0x0,auVar156);
          auVar71 = vshufpd_avx(auVar67,auVar67,3);
          auVar72 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar62 = vsubps_avx(auVar71,auVar67);
          auVar65 = vsubps_avx(auVar72,(undefined1  [16])0x0);
          auVar210._0_4_ = auVar62._0_4_ + auVar65._0_4_;
          auVar210._4_4_ = auVar62._4_4_ + auVar65._4_4_;
          auVar210._8_4_ = auVar62._8_4_ + auVar65._8_4_;
          auVar210._12_4_ = auVar62._12_4_ + auVar65._12_4_;
          auVar62 = vshufps_avx(auVar67,auVar67,0xb1);
          auVar65 = vshufps_avx(auVar187,auVar187,0xb1);
          auVar69 = vshufps_avx(auVar51,auVar51,0xb1);
          auVar70 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar260._4_4_ = auVar210._0_4_;
          auVar260._0_4_ = auVar210._0_4_;
          auVar260._8_4_ = auVar210._0_4_;
          auVar260._12_4_ = auVar210._0_4_;
          auVar48 = vshufps_avx(auVar210,auVar210,0x55);
          fVar225 = auVar48._0_4_;
          auVar221._0_4_ = auVar62._0_4_ * fVar225;
          fVar234 = auVar48._4_4_;
          auVar221._4_4_ = auVar62._4_4_ * fVar234;
          fVar235 = auVar48._8_4_;
          auVar221._8_4_ = auVar62._8_4_ * fVar235;
          fVar236 = auVar48._12_4_;
          auVar221._12_4_ = auVar62._12_4_ * fVar236;
          auVar227._0_4_ = auVar65._0_4_ * fVar225;
          auVar227._4_4_ = auVar65._4_4_ * fVar234;
          auVar227._8_4_ = auVar65._8_4_ * fVar235;
          auVar227._12_4_ = auVar65._12_4_ * fVar236;
          auVar243._0_4_ = auVar69._0_4_ * fVar225;
          auVar243._4_4_ = auVar69._4_4_ * fVar234;
          auVar243._8_4_ = auVar69._8_4_ * fVar235;
          auVar243._12_4_ = auVar69._12_4_ * fVar236;
          auVar211._0_4_ = auVar70._0_4_ * fVar225;
          auVar211._4_4_ = auVar70._4_4_ * fVar234;
          auVar211._8_4_ = auVar70._8_4_ * fVar235;
          auVar211._12_4_ = auVar70._12_4_ * fVar236;
          auVar62 = vfmadd231ps_fma(auVar221,auVar260,auVar67);
          auVar65 = vfmadd231ps_fma(auVar227,auVar260,auVar187);
          auVar52 = vfmadd231ps_fma(auVar243,auVar260,auVar51);
          auVar78 = vfmadd231ps_fma(auVar211,(undefined1  [16])0x0,auVar260);
          auVar48 = vshufpd_avx(auVar62,auVar62,1);
          auVar50 = vshufpd_avx(auVar65,auVar65,1);
          auVar74 = vshufpd_avx512vl(auVar52,auVar52,1);
          auVar75 = vshufpd_avx512vl(auVar78,auVar78,1);
          auVar69 = vminss_avx(auVar62,auVar65);
          auVar62 = vmaxss_avx(auVar65,auVar62);
          auVar70 = vminss_avx(auVar52,auVar78);
          auVar65 = vmaxss_avx(auVar78,auVar52);
          auVar69 = vminss_avx(auVar69,auVar70);
          auVar62 = vmaxss_avx(auVar65,auVar62);
          auVar70 = vminss_avx(auVar48,auVar50);
          auVar65 = vmaxss_avx(auVar50,auVar48);
          auVar48 = vminss_avx512f(auVar74,auVar75);
          auVar50 = vmaxss_avx512f(auVar75,auVar74);
          auVar65 = vmaxss_avx(auVar50,auVar65);
          auVar98._0_16_ = vminss_avx512f(auVar70,auVar48);
          vucomiss_avx512f(auVar69);
          fVar234 = auVar65._0_4_;
          fVar225 = auVar62._0_4_;
          if (4 < (uint)uVar37) {
            bVar47 = fVar234 == -0.0001;
            bVar44 = NAN(fVar234);
            if (fVar234 <= -0.0001) goto LAB_018fa5ee;
            break;
          }
LAB_018fa5ee:
          auVar70 = vucomiss_avx512f(auVar98._0_16_);
          bVar47 = fVar234 <= -0.0001;
          bVar45 = -0.0001 < fVar225;
          bVar44 = bVar47;
          if (!bVar47) break;
          uVar17 = vcmpps_avx512vl(auVar69,auVar70,5);
          uVar18 = vcmpps_avx512vl(auVar98._0_16_,auVar70,5);
          bVar35 = (byte)uVar17 & (byte)uVar18 & 1;
          bVar47 = bVar45 && bVar35 == 0;
          bVar44 = bVar45 && bVar35 == 0;
        } while (!bVar45 || bVar35 != 0);
        vcmpss_avx512f(auVar69,auVar56,1);
        auVar50 = auVar278._0_16_;
        uVar17 = vcmpss_avx512f(auVar62,auVar56,1);
        bVar45 = (bool)((byte)uVar17 & 1);
        auVar101._16_16_ = auVar98._16_16_;
        auVar101._0_16_ = auVar50;
        iVar117 = auVar278._0_4_;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (float)((uint)bVar45 * -0x40800000 + (uint)!bVar45 * iVar117);
        vucomiss_avx512f(auVar100._0_16_);
        bVar44 = (bool)(!bVar47 | bVar44);
        bVar45 = bVar44 == false;
        auVar103._16_16_ = auVar98._16_16_;
        auVar103._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar102._4_28_ = auVar103._4_28_;
        auVar102._0_4_ = (uint)bVar44 * auVar271._0_4_ + (uint)!bVar44 * 0x7f800000;
        auVar48 = auVar102._0_16_;
        auVar105._16_16_ = auVar98._16_16_;
        auVar105._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar104._4_28_ = auVar105._4_28_;
        auVar104._0_4_ = (uint)bVar44 * auVar271._0_4_ + (uint)!bVar44 * -0x800000;
        auVar70 = auVar104._0_16_;
        uVar17 = vcmpss_avx512f(auVar98._0_16_,auVar56,1);
        bVar47 = (bool)((byte)uVar17 & 1);
        auVar107._16_16_ = auVar98._16_16_;
        auVar107._0_16_ = auVar50;
        auVar106._4_28_ = auVar107._4_28_;
        auVar106._0_4_ = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * iVar117);
        vucomiss_avx512f(auVar106._0_16_);
        if ((bVar44) || (bVar45)) {
          auVar52 = vucomiss_avx512f(auVar69);
          if ((bVar44) || (bVar45)) {
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar78 = vxorps_avx512vl(auVar69,auVar23);
            auVar69 = vsubss_avx512f(auVar52,auVar69);
            auVar69 = vdivss_avx512f(auVar78,auVar69);
            auVar52 = vsubss_avx512f(auVar50,auVar69);
            auVar69 = vfmadd213ss_avx512f(auVar52,auVar56,auVar69);
            auVar52 = auVar69;
          }
          else {
            auVar52 = vxorps_avx512vl(auVar52,auVar52);
            vucomiss_avx512f(auVar52);
            if ((bVar44) || (auVar69 = auVar50, bVar45)) {
              auVar69 = SUB6416(ZEXT464(0xff800000),0);
              auVar52 = ZEXT416(0x7f800000);
            }
          }
          auVar48 = vminss_avx512f(auVar48,auVar52);
          auVar70 = vmaxss_avx(auVar69,auVar70);
        }
        uVar17 = vcmpss_avx512f(auVar65,auVar56,1);
        bVar47 = (bool)((byte)uVar17 & 1);
        fVar235 = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * iVar117);
        if ((auVar100._0_4_ != fVar235) || (NAN(auVar100._0_4_) || NAN(fVar235))) {
          if ((fVar234 != fVar225) || (NAN(fVar234) || NAN(fVar225))) {
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(auVar62,auVar22);
            auVar212._0_4_ = auVar62._0_4_ / (fVar234 - fVar225);
            auVar212._4_12_ = auVar62._4_12_;
            auVar62 = vsubss_avx512f(auVar50,auVar212);
            auVar62 = vfmadd213ss_avx512f(auVar62,auVar56,auVar212);
            auVar65 = auVar62;
          }
          else if ((fVar225 != 0.0) ||
                  (auVar62 = auVar50, auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar225))) {
            auVar62 = SUB6416(ZEXT464(0xff800000),0);
            auVar65 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar48 = vminss_avx(auVar48,auVar65);
          auVar70 = vmaxss_avx(auVar62,auVar70);
        }
        bVar47 = auVar106._0_4_ != fVar235;
        auVar62 = vminss_avx512f(auVar48,auVar50);
        auVar109._16_16_ = auVar98._16_16_;
        auVar109._0_16_ = auVar48;
        auVar108._4_28_ = auVar109._4_28_;
        auVar108._0_4_ = (uint)bVar47 * auVar62._0_4_ + (uint)!bVar47 * auVar48._0_4_;
        auVar62 = vmaxss_avx512f(auVar50,auVar70);
        auVar111._16_16_ = auVar98._16_16_;
        auVar111._0_16_ = auVar70;
        auVar110._4_28_ = auVar111._4_28_;
        auVar110._0_4_ = (uint)bVar47 * auVar62._0_4_ + (uint)!bVar47 * auVar70._0_4_;
        auVar62 = vmaxss_avx512f(auVar56,auVar108._0_16_);
        auVar98._0_16_ = vminss_avx512f(auVar110._0_16_,auVar50);
      } while (auVar98._0_4_ < auVar62._0_4_);
      auVar70 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar62._0_4_ + -0.1)));
      auVar52 = vminss_avx512f(ZEXT416((uint)(auVar98._0_4_ + 0.1)),auVar50);
      auVar137._0_8_ = auVar67._0_8_;
      auVar137._8_8_ = auVar137._0_8_;
      auVar228._8_8_ = auVar187._0_8_;
      auVar228._0_8_ = auVar187._0_8_;
      auVar244._8_8_ = auVar51._0_8_;
      auVar244._0_8_ = auVar51._0_8_;
      auVar62 = vshufpd_avx(auVar187,auVar187,3);
      auVar65 = vshufpd_avx(auVar51,auVar51,3);
      auVar69 = vshufps_avx(auVar70,auVar52,0);
      auVar51 = vsubps_avx512vl(auVar57,auVar69);
      fVar225 = auVar69._0_4_;
      auVar177._0_4_ = fVar225 * auVar71._0_4_;
      fVar234 = auVar69._4_4_;
      auVar177._4_4_ = fVar234 * auVar71._4_4_;
      fVar235 = auVar69._8_4_;
      auVar177._8_4_ = fVar235 * auVar71._8_4_;
      fVar236 = auVar69._12_4_;
      auVar177._12_4_ = fVar236 * auVar71._12_4_;
      auVar188._0_4_ = fVar225 * auVar62._0_4_;
      auVar188._4_4_ = fVar234 * auVar62._4_4_;
      auVar188._8_4_ = fVar235 * auVar62._8_4_;
      auVar188._12_4_ = fVar236 * auVar62._12_4_;
      auVar266._0_4_ = auVar65._0_4_ * fVar225;
      auVar266._4_4_ = auVar65._4_4_ * fVar234;
      auVar266._8_4_ = auVar65._8_4_ * fVar235;
      auVar266._12_4_ = auVar65._12_4_ * fVar236;
      auVar157._0_4_ = fVar225 * auVar72._0_4_;
      auVar157._4_4_ = fVar234 * auVar72._4_4_;
      auVar157._8_4_ = fVar235 * auVar72._8_4_;
      auVar157._12_4_ = fVar236 * auVar72._12_4_;
      auVar71 = vfmadd231ps_fma(auVar177,auVar51,auVar137);
      auVar72 = vfmadd231ps_fma(auVar188,auVar51,auVar228);
      auVar48 = vfmadd231ps_fma(auVar266,auVar51,auVar244);
      auVar51 = vfmadd231ps_fma(auVar157,auVar51,ZEXT816(0));
      auVar65 = vsubss_avx512f(auVar50,auVar70);
      auVar62 = vmovshdup_avx(auVar49);
      auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * auVar70._0_4_)),auVar49,auVar65);
      auVar65 = vsubss_avx512f(auVar50,auVar52);
      auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * auVar52._0_4_)),auVar49,auVar65);
      auVar49 = vdivss_avx512f(auVar50,ZEXT416((uint)fVar239));
      auVar62 = vsubps_avx(auVar72,auVar71);
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar69 = vmulps_avx512vl(auVar62,auVar52);
      auVar62 = vsubps_avx(auVar48,auVar72);
      auVar70 = vmulps_avx512vl(auVar62,auVar52);
      auVar62 = vsubps_avx(auVar51,auVar48);
      auVar62 = vmulps_avx512vl(auVar62,auVar52);
      auVar65 = vminps_avx(auVar70,auVar62);
      auVar62 = vmaxps_avx(auVar70,auVar62);
      auVar65 = vminps_avx(auVar69,auVar65);
      auVar62 = vmaxps_avx(auVar69,auVar62);
      auVar69 = vshufpd_avx(auVar65,auVar65,3);
      auVar70 = vshufpd_avx(auVar62,auVar62,3);
      auVar65 = vminps_avx(auVar65,auVar69);
      auVar62 = vmaxps_avx(auVar62,auVar70);
      fVar239 = auVar49._0_4_;
      auVar213._0_4_ = auVar65._0_4_ * fVar239;
      auVar213._4_4_ = auVar65._4_4_ * fVar239;
      auVar213._8_4_ = auVar65._8_4_ * fVar239;
      auVar213._12_4_ = auVar65._12_4_ * fVar239;
      auVar199._0_4_ = fVar239 * auVar62._0_4_;
      auVar199._4_4_ = fVar239 * auVar62._4_4_;
      auVar199._8_4_ = fVar239 * auVar62._8_4_;
      auVar199._12_4_ = fVar239 * auVar62._12_4_;
      auVar49 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar74._0_4_ - auVar67._0_4_)));
      auVar62 = vshufpd_avx(auVar71,auVar71,3);
      auVar65 = vshufpd_avx(auVar72,auVar72,3);
      auVar69 = vshufpd_avx(auVar48,auVar48,3);
      auVar70 = vshufpd_avx(auVar51,auVar51,3);
      auVar62 = vsubps_avx(auVar62,auVar71);
      auVar71 = vsubps_avx(auVar65,auVar72);
      auVar72 = vsubps_avx(auVar69,auVar48);
      auVar70 = vsubps_avx(auVar70,auVar51);
      auVar65 = vminps_avx(auVar62,auVar71);
      auVar62 = vmaxps_avx(auVar62,auVar71);
      auVar69 = vminps_avx(auVar72,auVar70);
      auVar69 = vminps_avx(auVar65,auVar69);
      auVar65 = vmaxps_avx(auVar72,auVar70);
      auVar62 = vmaxps_avx(auVar62,auVar65);
      fVar239 = auVar49._0_4_;
      auVar245._0_4_ = fVar239 * auVar69._0_4_;
      auVar245._4_4_ = fVar239 * auVar69._4_4_;
      auVar245._8_4_ = fVar239 * auVar69._8_4_;
      auVar245._12_4_ = fVar239 * auVar69._12_4_;
      auVar229._0_4_ = fVar239 * auVar62._0_4_;
      auVar229._4_4_ = fVar239 * auVar62._4_4_;
      auVar229._8_4_ = fVar239 * auVar62._8_4_;
      auVar229._12_4_ = fVar239 * auVar62._12_4_;
      auVar70 = vinsertps_avx(auVar63,auVar67,0x10);
      auVar75 = vpermt2ps_avx512vl(auVar63,_DAT_01fb9f90,auVar74);
      auVar129._0_4_ = auVar70._0_4_ + auVar75._0_4_;
      auVar129._4_4_ = auVar70._4_4_ + auVar75._4_4_;
      auVar129._8_4_ = auVar70._8_4_ + auVar75._8_4_;
      auVar129._12_4_ = auVar70._12_4_ + auVar75._12_4_;
      auVar51 = vmulps_avx512vl(auVar129,auVar279._0_16_);
      auVar65 = vshufps_avx(auVar51,auVar51,0x54);
      uVar118 = auVar51._0_4_;
      auVar133._4_4_ = uVar118;
      auVar133._0_4_ = uVar118;
      auVar133._8_4_ = uVar118;
      auVar133._12_4_ = uVar118;
      auVar69 = vfmadd213ps_fma(local_270,auVar133,auVar68);
      auVar71 = vfmadd213ps_fma(local_280,auVar133,auVar64);
      auVar72 = vfmadd213ps_fma(local_290,auVar133,auVar73);
      auVar62 = vsubps_avx(auVar71,auVar69);
      auVar69 = vfmadd213ps_fma(auVar62,auVar133,auVar69);
      auVar62 = vsubps_avx(auVar72,auVar71);
      auVar62 = vfmadd213ps_fma(auVar62,auVar133,auVar71);
      auVar62 = vsubps_avx(auVar62,auVar69);
      auVar69 = vfmadd231ps_fma(auVar69,auVar62,auVar133);
      auVar48 = vmulps_avx512vl(auVar62,auVar52);
      auVar254._8_8_ = auVar69._0_8_;
      auVar254._0_8_ = auVar69._0_8_;
      auVar62 = vshufpd_avx(auVar69,auVar69,3);
      auVar69 = vshufps_avx(auVar51,auVar51,0x55);
      auVar71 = vsubps_avx(auVar62,auVar254);
      auVar72 = vfmadd231ps_fma(auVar254,auVar69,auVar71);
      auVar267._8_8_ = auVar48._0_8_;
      auVar267._0_8_ = auVar48._0_8_;
      auVar62 = vshufpd_avx(auVar48,auVar48,3);
      auVar62 = vsubps_avx512vl(auVar62,auVar267);
      auVar62 = vfmadd213ps_avx512vl(auVar62,auVar69,auVar267);
      auVar134._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
      auVar134._8_4_ = auVar71._8_4_ ^ 0x80000000;
      auVar134._12_4_ = auVar71._12_4_ ^ 0x80000000;
      auVar69 = vmovshdup_avx512vl(auVar62);
      auVar268._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
      auVar268._8_4_ = auVar69._8_4_ ^ 0x80000000;
      auVar268._12_4_ = auVar69._12_4_ ^ 0x80000000;
      auVar48 = vmovshdup_avx512vl(auVar71);
      auVar49 = vpermt2ps_avx512vl(auVar268,ZEXT416(5),auVar71);
      auVar69 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar69._0_4_ * auVar71._0_4_)),auVar62,auVar48);
      auVar71 = vpermt2ps_avx512vl(auVar62,SUB6416(ZEXT464(4),0),auVar134);
      auVar158._0_4_ = auVar69._0_4_;
      auVar158._4_4_ = auVar158._0_4_;
      auVar158._8_4_ = auVar158._0_4_;
      auVar158._12_4_ = auVar158._0_4_;
      auVar62 = vdivps_avx(auVar49,auVar158);
      auVar76 = vdivps_avx512vl(auVar71,auVar158);
      fVar239 = auVar72._0_4_;
      auVar69 = vshufps_avx(auVar72,auVar72,0x55);
      auVar255._0_4_ = fVar239 * auVar62._0_4_ + auVar69._0_4_ * auVar76._0_4_;
      auVar255._4_4_ = fVar239 * auVar62._4_4_ + auVar69._4_4_ * auVar76._4_4_;
      auVar255._8_4_ = fVar239 * auVar62._8_4_ + auVar69._8_4_ * auVar76._8_4_;
      auVar255._12_4_ = fVar239 * auVar62._12_4_ + auVar69._12_4_ * auVar76._12_4_;
      auVar52 = vsubps_avx(auVar65,auVar255);
      auVar69 = vmovshdup_avx(auVar62);
      auVar65 = vinsertps_avx(auVar213,auVar245,0x1c);
      auVar269._0_4_ = auVar69._0_4_ * auVar65._0_4_;
      auVar269._4_4_ = auVar69._4_4_ * auVar65._4_4_;
      auVar269._8_4_ = auVar69._8_4_ * auVar65._8_4_;
      auVar269._12_4_ = auVar69._12_4_ * auVar65._12_4_;
      auVar78 = vinsertps_avx512f(auVar199,auVar229,0x1c);
      auVar69 = vmulps_avx512vl(auVar69,auVar78);
      auVar49 = vminps_avx512vl(auVar269,auVar69);
      auVar72 = vmaxps_avx(auVar69,auVar269);
      auVar48 = vmovshdup_avx(auVar76);
      auVar69 = vinsertps_avx(auVar245,auVar213,0x4c);
      auVar246._0_4_ = auVar48._0_4_ * auVar69._0_4_;
      auVar246._4_4_ = auVar48._4_4_ * auVar69._4_4_;
      auVar246._8_4_ = auVar48._8_4_ * auVar69._8_4_;
      auVar246._12_4_ = auVar48._12_4_ * auVar69._12_4_;
      auVar71 = vinsertps_avx(auVar229,auVar199,0x4c);
      auVar230._0_4_ = auVar48._0_4_ * auVar71._0_4_;
      auVar230._4_4_ = auVar48._4_4_ * auVar71._4_4_;
      auVar230._8_4_ = auVar48._8_4_ * auVar71._8_4_;
      auVar230._12_4_ = auVar48._12_4_ * auVar71._12_4_;
      auVar48 = vminps_avx(auVar246,auVar230);
      auVar49 = vaddps_avx512vl(auVar49,auVar48);
      auVar48 = vmaxps_avx(auVar230,auVar246);
      auVar231._0_4_ = auVar72._0_4_ + auVar48._0_4_;
      auVar231._4_4_ = auVar72._4_4_ + auVar48._4_4_;
      auVar231._8_4_ = auVar72._8_4_ + auVar48._8_4_;
      auVar231._12_4_ = auVar72._12_4_ + auVar48._12_4_;
      auVar247._8_8_ = 0x3f80000000000000;
      auVar247._0_8_ = 0x3f80000000000000;
      auVar72 = vsubps_avx(auVar247,auVar231);
      auVar48 = vsubps_avx(auVar247,auVar49);
      auVar49 = vsubps_avx(auVar70,auVar51);
      auVar51 = vsubps_avx(auVar75,auVar51);
      fVar236 = auVar49._0_4_;
      auVar270._0_4_ = fVar236 * auVar72._0_4_;
      fVar237 = auVar49._4_4_;
      auVar270._4_4_ = fVar237 * auVar72._4_4_;
      fVar238 = auVar49._8_4_;
      auVar270._8_4_ = fVar238 * auVar72._8_4_;
      fVar191 = auVar49._12_4_;
      auVar270._12_4_ = fVar191 * auVar72._12_4_;
      auVar77 = vbroadcastss_avx512vl(auVar62);
      auVar65 = vmulps_avx512vl(auVar77,auVar65);
      auVar78 = vmulps_avx512vl(auVar77,auVar78);
      auVar77 = vminps_avx512vl(auVar65,auVar78);
      auVar78 = vmaxps_avx512vl(auVar78,auVar65);
      auVar65 = vbroadcastss_avx512vl(auVar76);
      auVar69 = vmulps_avx512vl(auVar65,auVar69);
      auVar65 = vmulps_avx512vl(auVar65,auVar71);
      auVar71 = vminps_avx512vl(auVar69,auVar65);
      auVar71 = vaddps_avx512vl(auVar77,auVar71);
      auVar49 = vmulps_avx512vl(auVar49,auVar48);
      fVar239 = auVar51._0_4_;
      auVar232._0_4_ = fVar239 * auVar72._0_4_;
      fVar225 = auVar51._4_4_;
      auVar232._4_4_ = fVar225 * auVar72._4_4_;
      fVar234 = auVar51._8_4_;
      auVar232._8_4_ = fVar234 * auVar72._8_4_;
      fVar235 = auVar51._12_4_;
      auVar232._12_4_ = fVar235 * auVar72._12_4_;
      auVar248._0_4_ = fVar239 * auVar48._0_4_;
      auVar248._4_4_ = fVar225 * auVar48._4_4_;
      auVar248._8_4_ = fVar234 * auVar48._8_4_;
      auVar248._12_4_ = fVar235 * auVar48._12_4_;
      auVar65 = vmaxps_avx(auVar65,auVar69);
      auVar200._0_4_ = auVar78._0_4_ + auVar65._0_4_;
      auVar200._4_4_ = auVar78._4_4_ + auVar65._4_4_;
      auVar200._8_4_ = auVar78._8_4_ + auVar65._8_4_;
      auVar200._12_4_ = auVar78._12_4_ + auVar65._12_4_;
      auVar214._8_8_ = 0x3f800000;
      auVar214._0_8_ = 0x3f800000;
      auVar65 = vsubps_avx(auVar214,auVar200);
      auVar69 = vsubps_avx512vl(auVar214,auVar71);
      auVar261._0_4_ = fVar236 * auVar65._0_4_;
      auVar261._4_4_ = fVar237 * auVar65._4_4_;
      auVar261._8_4_ = fVar238 * auVar65._8_4_;
      auVar261._12_4_ = fVar191 * auVar65._12_4_;
      auVar256._0_4_ = fVar236 * auVar69._0_4_;
      auVar256._4_4_ = fVar237 * auVar69._4_4_;
      auVar256._8_4_ = fVar238 * auVar69._8_4_;
      auVar256._12_4_ = fVar191 * auVar69._12_4_;
      auVar201._0_4_ = fVar239 * auVar65._0_4_;
      auVar201._4_4_ = fVar225 * auVar65._4_4_;
      auVar201._8_4_ = fVar234 * auVar65._8_4_;
      auVar201._12_4_ = fVar235 * auVar65._12_4_;
      auVar215._0_4_ = fVar239 * auVar69._0_4_;
      auVar215._4_4_ = fVar225 * auVar69._4_4_;
      auVar215._8_4_ = fVar234 * auVar69._8_4_;
      auVar215._12_4_ = fVar235 * auVar69._12_4_;
      auVar65 = vminps_avx(auVar261,auVar256);
      auVar69 = vminps_avx512vl(auVar201,auVar215);
      auVar71 = vminps_avx512vl(auVar65,auVar69);
      auVar65 = vmaxps_avx(auVar256,auVar261);
      auVar69 = vmaxps_avx(auVar215,auVar201);
      auVar69 = vmaxps_avx(auVar69,auVar65);
      auVar72 = vminps_avx512vl(auVar270,auVar49);
      auVar65 = vminps_avx(auVar232,auVar248);
      auVar65 = vminps_avx(auVar72,auVar65);
      auVar65 = vhaddps_avx(auVar71,auVar65);
      auVar98._0_16_ = vmaxps_avx512vl(auVar49,auVar270);
      auVar71 = vmaxps_avx(auVar248,auVar232);
      auVar71 = vmaxps_avx(auVar71,auVar98._0_16_);
      auVar69 = vhaddps_avx(auVar69,auVar71);
      auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
      auVar69 = vshufps_avx(auVar69,auVar69,0xe8);
      auVar202._0_4_ = auVar65._0_4_ + auVar52._0_4_;
      auVar202._4_4_ = auVar65._4_4_ + auVar52._4_4_;
      auVar202._8_4_ = auVar65._8_4_ + auVar52._8_4_;
      auVar202._12_4_ = auVar65._12_4_ + auVar52._12_4_;
      auVar216._0_4_ = auVar69._0_4_ + auVar52._0_4_;
      auVar216._4_4_ = auVar69._4_4_ + auVar52._4_4_;
      auVar216._8_4_ = auVar69._8_4_ + auVar52._8_4_;
      auVar216._12_4_ = auVar69._12_4_ + auVar52._12_4_;
      auVar65 = vmaxps_avx(auVar70,auVar202);
      auVar69 = vminps_avx(auVar216,auVar75);
      uVar3 = vcmpps_avx512vl(auVar69,auVar65,1);
    } while ((uVar3 & 3) != 0);
    uVar3 = vcmpps_avx512vl(auVar216,auVar75,1);
    uVar17 = vcmpps_avx512vl(auVar63,auVar202,1);
    if (((ushort)uVar17 & (ushort)uVar3 & 1) == 0) {
      bVar35 = 0;
    }
    else {
      auVar65 = vmovshdup_avx(auVar202);
      bVar35 = auVar67._0_4_ < auVar65._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar37 || uVar116 != 0 && !bVar46) | bVar35) == 1) {
      lVar40 = 0xc9;
      do {
        lVar40 = lVar40 + -1;
        if (lVar40 == 0) goto LAB_018fa3c0;
        auVar63 = vsubss_avx512f(auVar50,auVar52);
        fVar234 = auVar63._0_4_;
        fVar239 = fVar234 * fVar234 * fVar234;
        auVar63 = vmulss_avx512f(auVar52,ZEXT416(0x40400000));
        fVar225 = auVar63._0_4_ * fVar234 * fVar234;
        fVar235 = auVar52._0_4_;
        auVar63 = vmulss_avx512f(ZEXT416((uint)(fVar235 * fVar235)),ZEXT416(0x40400000));
        fVar234 = fVar234 * auVar63._0_4_;
        auVar146._4_4_ = fVar239;
        auVar146._0_4_ = fVar239;
        auVar146._8_4_ = fVar239;
        auVar146._12_4_ = fVar239;
        auVar138._4_4_ = fVar225;
        auVar138._0_4_ = fVar225;
        auVar138._8_4_ = fVar225;
        auVar138._12_4_ = fVar225;
        auVar122._4_4_ = fVar234;
        auVar122._0_4_ = fVar234;
        auVar122._8_4_ = fVar234;
        auVar122._12_4_ = fVar234;
        fVar235 = fVar235 * fVar235 * fVar235;
        auVar178._0_4_ = (float)local_2a0._0_4_ * fVar235;
        auVar178._4_4_ = (float)local_2a0._4_4_ * fVar235;
        auVar178._8_4_ = fStack_298 * fVar235;
        auVar178._12_4_ = fStack_294 * fVar235;
        auVar63 = vfmadd231ps_fma(auVar178,auVar73,auVar122);
        auVar63 = vfmadd231ps_fma(auVar63,auVar64,auVar138);
        auVar63 = vfmadd231ps_fma(auVar63,auVar68,auVar146);
        auVar123._8_8_ = auVar63._0_8_;
        auVar123._0_8_ = auVar63._0_8_;
        auVar63 = vshufpd_avx(auVar63,auVar63,3);
        auVar65 = vshufps_avx(auVar52,auVar52,0x55);
        auVar63 = vsubps_avx(auVar63,auVar123);
        auVar65 = vfmadd213ps_fma(auVar63,auVar65,auVar123);
        fVar239 = auVar65._0_4_;
        auVar63 = vshufps_avx(auVar65,auVar65,0x55);
        auVar124._0_4_ = auVar62._0_4_ * fVar239 + auVar76._0_4_ * auVar63._0_4_;
        auVar124._4_4_ = auVar62._4_4_ * fVar239 + auVar76._4_4_ * auVar63._4_4_;
        auVar124._8_4_ = auVar62._8_4_ * fVar239 + auVar76._8_4_ * auVar63._8_4_;
        auVar124._12_4_ = auVar62._12_4_ * fVar239 + auVar76._12_4_ * auVar63._12_4_;
        auVar52 = vsubps_avx(auVar52,auVar124);
        auVar63 = vandps_avx512vl(auVar65,auVar276._0_16_);
        auVar98._0_16_ = vprolq_avx512vl(auVar63,0x20);
        auVar63 = vmaxss_avx(auVar98._0_16_,auVar63);
        bVar46 = auVar63._0_4_ <= (float)local_2b0._0_4_;
      } while ((float)local_2b0._0_4_ <= auVar63._0_4_);
      auVar63 = vucomiss_avx512f(auVar56);
      if (bVar46) {
        auVar62 = vucomiss_avx512f(auVar63);
        auVar278 = ZEXT1664(auVar62);
        if (bVar46) {
          vmovshdup_avx(auVar63);
          auVar62 = vucomiss_avx512f(auVar56);
          if (bVar46) {
            auVar65 = vucomiss_avx512f(auVar62);
            auVar278 = ZEXT1664(auVar65);
            if (bVar46) {
              auVar69 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar51 = vinsertps_avx(auVar69,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar69 = vdpps_avx(auVar51,local_2c0,0x7f);
              auVar70 = vdpps_avx(auVar51,local_2d0,0x7f);
              auVar71 = vdpps_avx(auVar51,local_2e0,0x7f);
              auVar72 = vdpps_avx(auVar51,local_2f0,0x7f);
              auVar48 = vdpps_avx(auVar51,local_300,0x7f);
              auVar49 = vdpps_avx(auVar51,local_310,0x7f);
              auVar50 = vdpps_avx(auVar51,local_320,0x7f);
              auVar51 = vdpps_avx(auVar51,local_330,0x7f);
              auVar52 = vsubss_avx512f(auVar65,auVar62);
              fVar235 = auVar62._0_4_;
              auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * auVar48._0_4_)),auVar52,auVar69);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * fVar235)),auVar52,auVar70);
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar235)),auVar52,auVar71);
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * auVar51._0_4_)),auVar52,auVar72);
              auVar65 = vsubss_avx512f(auVar65,auVar63);
              auVar189._0_4_ = auVar65._0_4_;
              fVar239 = auVar189._0_4_ * auVar189._0_4_ * auVar189._0_4_;
              auVar65 = vmulss_avx512f(auVar63,ZEXT416(0x40400000));
              fVar225 = auVar65._0_4_ * auVar189._0_4_ * auVar189._0_4_;
              local_120 = auVar63._0_4_;
              auVar179._0_4_ = local_120 * local_120;
              auVar179._4_4_ = auVar63._4_4_ * auVar63._4_4_;
              auVar179._8_4_ = auVar63._8_4_ * auVar63._8_4_;
              auVar179._12_4_ = auVar63._12_4_ * auVar63._12_4_;
              auVar98._0_16_ = vmulss_avx512f(auVar179,ZEXT416(0x40400000));
              fVar234 = auVar189._0_4_ * auVar98._0_4_;
              fVar237 = local_120 * auVar179._0_4_;
              auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * auVar71._0_4_)),
                                        ZEXT416((uint)fVar234),auVar70);
              auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar225),auVar69);
              auVar62 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar239),auVar62);
              fVar236 = auVar62._0_4_;
              if ((fVar165 <= fVar236) &&
                 (fVar238 = *(float *)(ray + k * 4 + 0x100), fVar236 <= fVar238)) {
                auVar62 = vshufps_avx(auVar63,auVar63,0x55);
                auVar69 = vsubps_avx512vl(auVar57,auVar62);
                fVar191 = auVar62._0_4_;
                auVar222._0_4_ = fVar191 * (float)local_380._0_4_;
                fVar206 = auVar62._4_4_;
                auVar222._4_4_ = fVar206 * (float)local_380._4_4_;
                fVar207 = auVar62._8_4_;
                auVar222._8_4_ = fVar207 * fStack_378;
                fVar208 = auVar62._12_4_;
                auVar222._12_4_ = fVar208 * fStack_374;
                auVar233._0_4_ = fVar191 * (float)local_390._0_4_;
                auVar233._4_4_ = fVar206 * (float)local_390._4_4_;
                auVar233._8_4_ = fVar207 * fStack_388;
                auVar233._12_4_ = fVar208 * fStack_384;
                auVar249._0_4_ = fVar191 * (float)local_3a0._0_4_;
                auVar249._4_4_ = fVar206 * (float)local_3a0._4_4_;
                auVar249._8_4_ = fVar207 * fStack_398;
                auVar249._12_4_ = fVar208 * fStack_394;
                auVar203._0_4_ = fVar191 * (float)local_3b0._0_4_;
                auVar203._4_4_ = fVar206 * (float)local_3b0._4_4_;
                auVar203._8_4_ = fVar207 * fStack_3a8;
                auVar203._12_4_ = fVar208 * fStack_3a4;
                auVar57 = vfmadd231ps_fma(auVar222,auVar69,local_340);
                auVar62 = vfmadd231ps_fma(auVar233,auVar69,local_350);
                auVar65 = vfmadd231ps_fma(auVar249,auVar69,local_360);
                auVar69 = vfmadd231ps_fma(auVar203,auVar69,local_370);
                auVar57 = vsubps_avx(auVar62,auVar57);
                auVar62 = vsubps_avx(auVar65,auVar62);
                auVar65 = vsubps_avx(auVar69,auVar65);
                auVar250._0_4_ = local_120 * auVar62._0_4_;
                auVar250._4_4_ = local_120 * auVar62._4_4_;
                auVar250._8_4_ = local_120 * auVar62._8_4_;
                auVar250._12_4_ = local_120 * auVar62._12_4_;
                auVar189._4_4_ = auVar189._0_4_;
                auVar189._8_4_ = auVar189._0_4_;
                auVar189._12_4_ = auVar189._0_4_;
                auVar57 = vfmadd231ps_fma(auVar250,auVar189,auVar57);
                auVar204._0_4_ = local_120 * auVar65._0_4_;
                auVar204._4_4_ = local_120 * auVar65._4_4_;
                auVar204._8_4_ = local_120 * auVar65._8_4_;
                auVar204._12_4_ = local_120 * auVar65._12_4_;
                auVar62 = vfmadd231ps_fma(auVar204,auVar189,auVar62);
                auVar205._0_4_ = local_120 * auVar62._0_4_;
                auVar205._4_4_ = local_120 * auVar62._4_4_;
                auVar205._8_4_ = local_120 * auVar62._8_4_;
                auVar205._12_4_ = local_120 * auVar62._12_4_;
                auVar57 = vfmadd231ps_fma(auVar205,auVar189,auVar57);
                auVar21._8_4_ = 0x40400000;
                auVar21._0_8_ = 0x4040000040400000;
                auVar21._12_4_ = 0x40400000;
                auVar98._0_16_ = vmulps_avx512vl(auVar57,auVar21);
                pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar180._0_4_ = fVar237 * (float)local_3f0._0_4_;
                  auVar180._4_4_ = fVar237 * (float)local_3f0._4_4_;
                  auVar180._8_4_ = fVar237 * fStack_3e8;
                  auVar180._12_4_ = fVar237 * fStack_3e4;
                  auVar159._4_4_ = fVar234;
                  auVar159._0_4_ = fVar234;
                  auVar159._8_4_ = fVar234;
                  auVar159._12_4_ = fVar234;
                  auVar57 = vfmadd132ps_fma(auVar159,auVar180,local_3e0);
                  auVar147._4_4_ = fVar225;
                  auVar147._0_4_ = fVar225;
                  auVar147._8_4_ = fVar225;
                  auVar147._12_4_ = fVar225;
                  auVar57 = vfmadd132ps_fma(auVar147,auVar57,local_3d0);
                  auVar139._4_4_ = fVar239;
                  auVar139._0_4_ = fVar239;
                  auVar139._8_4_ = fVar239;
                  auVar139._12_4_ = fVar239;
                  auVar65 = vfmadd132ps_fma(auVar139,auVar57,local_3c0);
                  auVar57 = vshufps_avx(auVar65,auVar65,0xc9);
                  auVar62 = vshufps_avx(auVar98._0_16_,auVar98._0_16_,0xc9);
                  auVar140._0_4_ = auVar65._0_4_ * auVar62._0_4_;
                  auVar140._4_4_ = auVar65._4_4_ * auVar62._4_4_;
                  auVar140._8_4_ = auVar65._8_4_ * auVar62._8_4_;
                  auVar140._12_4_ = auVar65._12_4_ * auVar62._12_4_;
                  auVar57 = vfmsub231ps_fma(auVar140,auVar98._0_16_,auVar57);
                  local_140 = auVar57._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar236;
                    uVar118 = vextractps_avx(auVar57,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar118;
                    uVar118 = vextractps_avx(auVar57,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar118;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar235;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_018fa3c0;
                  }
                  auVar148._8_4_ = 1;
                  auVar148._0_8_ = 0x100000001;
                  auVar148._12_4_ = 1;
                  auVar148._16_4_ = 1;
                  auVar148._20_4_ = 1;
                  auVar148._24_4_ = 1;
                  auVar148._28_4_ = 1;
                  local_100 = vpermps_avx2(auVar148,ZEXT1632(auVar63));
                  auVar94 = vpermps_avx2(auVar148,ZEXT1632(auVar57));
                  auVar163._8_4_ = 2;
                  auVar163._0_8_ = 0x200000002;
                  auVar163._12_4_ = 2;
                  auVar163._16_4_ = 2;
                  auVar163._20_4_ = 2;
                  auVar163._24_4_ = 2;
                  auVar163._28_4_ = 2;
                  local_160 = vpermps_avx2(auVar163,ZEXT1632(auVar57));
                  local_180[0] = (RTCHitN)auVar94[0];
                  local_180[1] = (RTCHitN)auVar94[1];
                  local_180[2] = (RTCHitN)auVar94[2];
                  local_180[3] = (RTCHitN)auVar94[3];
                  local_180[4] = (RTCHitN)auVar94[4];
                  local_180[5] = (RTCHitN)auVar94[5];
                  local_180[6] = (RTCHitN)auVar94[6];
                  local_180[7] = (RTCHitN)auVar94[7];
                  local_180[8] = (RTCHitN)auVar94[8];
                  local_180[9] = (RTCHitN)auVar94[9];
                  local_180[10] = (RTCHitN)auVar94[10];
                  local_180[0xb] = (RTCHitN)auVar94[0xb];
                  local_180[0xc] = (RTCHitN)auVar94[0xc];
                  local_180[0xd] = (RTCHitN)auVar94[0xd];
                  local_180[0xe] = (RTCHitN)auVar94[0xe];
                  local_180[0xf] = (RTCHitN)auVar94[0xf];
                  local_180[0x10] = (RTCHitN)auVar94[0x10];
                  local_180[0x11] = (RTCHitN)auVar94[0x11];
                  local_180[0x12] = (RTCHitN)auVar94[0x12];
                  local_180[0x13] = (RTCHitN)auVar94[0x13];
                  local_180[0x14] = (RTCHitN)auVar94[0x14];
                  local_180[0x15] = (RTCHitN)auVar94[0x15];
                  local_180[0x16] = (RTCHitN)auVar94[0x16];
                  local_180[0x17] = (RTCHitN)auVar94[0x17];
                  local_180[0x18] = (RTCHitN)auVar94[0x18];
                  local_180[0x19] = (RTCHitN)auVar94[0x19];
                  local_180[0x1a] = (RTCHitN)auVar94[0x1a];
                  local_180[0x1b] = (RTCHitN)auVar94[0x1b];
                  local_180[0x1c] = (RTCHitN)auVar94[0x1c];
                  local_180[0x1d] = (RTCHitN)auVar94[0x1d];
                  local_180[0x1e] = (RTCHitN)auVar94[0x1e];
                  local_180[0x1f] = (RTCHitN)auVar94[0x1f];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  local_e0 = local_200._0_8_;
                  uStack_d8 = local_200._8_8_;
                  uStack_d0 = local_200._16_8_;
                  uStack_c8 = local_200._24_8_;
                  local_c0 = local_1e0;
                  vpcmpeqd_avx2(local_1e0,local_1e0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar236;
                  local_420 = local_220;
                  local_460.valid = (int *)local_420;
                  local_460.geometryUserPtr = pGVar8->userPtr;
                  local_460.context = context->user;
                  local_460.hit = local_180;
                  local_460.N = 8;
                  local_460.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_460);
                    auVar275 = ZEXT3264(_DAT_01fb9fe0);
                    auVar274 = ZEXT464(0x3a83126f);
                    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar273 = ZEXT1664(auVar63);
                    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar272 = ZEXT3264(auVar98);
                    auVar278 = ZEXT464(0x3f800000);
                    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar279 = ZEXT1664(auVar63);
                    auVar63 = vxorps_avx512vl(auVar56,auVar56);
                    auVar271 = ZEXT1664(auVar63);
                    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar277 = ZEXT1664(auVar63);
                    auVar98._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar276 = ZEXT1664(auVar98._0_16_);
                  }
                  auVar63 = auVar271._0_16_;
                  if (local_420 != (undefined1  [32])0x0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_460);
                      auVar275 = ZEXT3264(_DAT_01fb9fe0);
                      auVar274 = ZEXT464(0x3a83126f);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar273 = ZEXT1664(auVar56);
                      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar272 = ZEXT3264(auVar98);
                      auVar278 = ZEXT464(0x3f800000);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar279 = ZEXT1664(auVar56);
                      auVar63 = vxorps_avx512vl(auVar63,auVar63);
                      auVar271 = ZEXT1664(auVar63);
                      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar277 = ZEXT1664(auVar63);
                      auVar98._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar276 = ZEXT1664(auVar98._0_16_);
                    }
                    if (local_420 != (undefined1  [32])0x0) {
                      uVar3 = vptestmd_avx512vl(local_420,local_420);
                      iVar117 = *(int *)(local_460.hit + 4);
                      iVar29 = *(int *)(local_460.hit + 8);
                      iVar30 = *(int *)(local_460.hit + 0xc);
                      iVar31 = *(int *)(local_460.hit + 0x10);
                      iVar32 = *(int *)(local_460.hit + 0x14);
                      iVar33 = *(int *)(local_460.hit + 0x18);
                      iVar34 = *(int *)(local_460.hit + 0x1c);
                      bVar35 = (byte)uVar3;
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar16 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x180) =
                           (uint)(bVar35 & 1) * *(int *)local_460.hit |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x180);
                      *(uint *)(local_460.ray + 0x184) =
                           (uint)bVar46 * iVar117 | (uint)!bVar46 * *(int *)(local_460.ray + 0x184);
                      *(uint *)(local_460.ray + 0x188) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x188);
                      *(uint *)(local_460.ray + 0x18c) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x18c);
                      *(uint *)(local_460.ray + 400) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 400);
                      *(uint *)(local_460.ray + 0x194) =
                           (uint)bVar14 * iVar32 | (uint)!bVar14 * *(int *)(local_460.ray + 0x194);
                      *(uint *)(local_460.ray + 0x198) =
                           (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_460.ray + 0x198);
                      *(uint *)(local_460.ray + 0x19c) =
                           (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_460.ray + 0x19c);
                      iVar117 = *(int *)(local_460.hit + 0x24);
                      iVar29 = *(int *)(local_460.hit + 0x28);
                      iVar30 = *(int *)(local_460.hit + 0x2c);
                      iVar31 = *(int *)(local_460.hit + 0x30);
                      iVar32 = *(int *)(local_460.hit + 0x34);
                      iVar33 = *(int *)(local_460.hit + 0x38);
                      iVar34 = *(int *)(local_460.hit + 0x3c);
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar16 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x1a0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x20) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1a0);
                      *(uint *)(local_460.ray + 0x1a4) =
                           (uint)bVar46 * iVar117 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1a4);
                      *(uint *)(local_460.ray + 0x1a8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1a8);
                      *(uint *)(local_460.ray + 0x1ac) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1ac);
                      *(uint *)(local_460.ray + 0x1b0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1b0);
                      *(uint *)(local_460.ray + 0x1b4) =
                           (uint)bVar14 * iVar32 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1b4);
                      *(uint *)(local_460.ray + 0x1b8) =
                           (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1b8);
                      *(uint *)(local_460.ray + 0x1bc) =
                           (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_460.ray + 0x1bc);
                      iVar117 = *(int *)(local_460.hit + 0x44);
                      iVar29 = *(int *)(local_460.hit + 0x48);
                      iVar30 = *(int *)(local_460.hit + 0x4c);
                      iVar31 = *(int *)(local_460.hit + 0x50);
                      iVar32 = *(int *)(local_460.hit + 0x54);
                      iVar33 = *(int *)(local_460.hit + 0x58);
                      iVar34 = *(int *)(local_460.hit + 0x5c);
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar16 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x1c0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x40) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1c0);
                      *(uint *)(local_460.ray + 0x1c4) =
                           (uint)bVar46 * iVar117 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1c4);
                      *(uint *)(local_460.ray + 0x1c8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1c8);
                      *(uint *)(local_460.ray + 0x1cc) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1cc);
                      *(uint *)(local_460.ray + 0x1d0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1d0);
                      *(uint *)(local_460.ray + 0x1d4) =
                           (uint)bVar14 * iVar32 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1d4);
                      *(uint *)(local_460.ray + 0x1d8) =
                           (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1d8);
                      *(uint *)(local_460.ray + 0x1dc) =
                           (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_460.ray + 0x1dc);
                      iVar117 = *(int *)(local_460.hit + 100);
                      iVar29 = *(int *)(local_460.hit + 0x68);
                      iVar30 = *(int *)(local_460.hit + 0x6c);
                      iVar31 = *(int *)(local_460.hit + 0x70);
                      iVar32 = *(int *)(local_460.hit + 0x74);
                      iVar33 = *(int *)(local_460.hit + 0x78);
                      iVar34 = *(int *)(local_460.hit + 0x7c);
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar3 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar3 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar3 >> 4) & 1);
                      bVar14 = (bool)((byte)(uVar3 >> 5) & 1);
                      bVar15 = (bool)((byte)(uVar3 >> 6) & 1);
                      bVar16 = SUB81(uVar3 >> 7,0);
                      *(uint *)(local_460.ray + 0x1e0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x60) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1e0);
                      *(uint *)(local_460.ray + 0x1e4) =
                           (uint)bVar46 * iVar117 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1e4);
                      *(uint *)(local_460.ray + 0x1e8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1e8);
                      *(uint *)(local_460.ray + 0x1ec) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1ec);
                      *(uint *)(local_460.ray + 0x1f0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1f0);
                      *(uint *)(local_460.ray + 500) =
                           (uint)bVar14 * iVar32 | (uint)!bVar14 * *(int *)(local_460.ray + 500);
                      *(uint *)(local_460.ray + 0x1f8) =
                           (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1f8);
                      *(uint *)(local_460.ray + 0x1fc) =
                           (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_460.ray + 0x1fc);
                      iVar117 = *(int *)(local_460.ray + 0x204);
                      iVar29 = *(int *)(local_460.ray + 0x208);
                      iVar30 = *(int *)(local_460.ray + 0x20c);
                      iVar31 = *(int *)(local_460.ray + 0x210);
                      iVar32 = *(int *)(local_460.ray + 0x214);
                      iVar33 = *(int *)(local_460.ray + 0x218);
                      iVar34 = *(int *)(local_460.ray + 0x21c);
                      auVar112._0_4_ =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x80) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x200);
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      auVar112._4_4_ =
                           (uint)bVar46 * *(int *)(local_460.hit + 0x84) | (uint)!bVar46 * iVar117;
                      bVar46 = (bool)((byte)(uVar3 >> 2) & 1);
                      auVar112._8_4_ =
                           (uint)bVar46 * *(int *)(local_460.hit + 0x88) | (uint)!bVar46 * iVar29;
                      bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
                      auVar112._12_4_ =
                           (uint)bVar46 * *(int *)(local_460.hit + 0x8c) | (uint)!bVar46 * iVar30;
                      bVar46 = (bool)((byte)(uVar3 >> 4) & 1);
                      auVar112._16_4_ =
                           (uint)bVar46 * *(int *)(local_460.hit + 0x90) | (uint)!bVar46 * iVar31;
                      bVar46 = (bool)((byte)(uVar3 >> 5) & 1);
                      auVar112._20_4_ =
                           (uint)bVar46 * *(int *)(local_460.hit + 0x94) | (uint)!bVar46 * iVar32;
                      bVar46 = (bool)((byte)(uVar3 >> 6) & 1);
                      auVar112._24_4_ =
                           (uint)bVar46 * *(int *)(local_460.hit + 0x98) | (uint)!bVar46 * iVar33;
                      bVar46 = SUB81(uVar3 >> 7,0);
                      auVar112._28_4_ =
                           (uint)bVar46 * *(int *)(local_460.hit + 0x9c) | (uint)!bVar46 * iVar34;
                      *(undefined1 (*) [32])(local_460.ray + 0x200) = auVar112;
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      uVar116 = bVar46 * auVar112._4_4_ | (uint)!bVar46 * iVar117;
                      auVar25._4_24_ = auVar112._8_24_;
                      auVar25._0_4_ = uVar116;
                      auVar113._0_8_ = auVar25._0_8_ << 0x20;
                      bVar46 = (bool)((byte)(uVar3 >> 2) & 1);
                      auVar113._8_4_ = bVar46 * auVar112._8_4_ | (uint)!bVar46 * iVar29;
                      bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
                      auVar113._12_4_ = bVar46 * auVar112._12_4_ | (uint)!bVar46 * iVar30;
                      bVar46 = (bool)((byte)(uVar3 >> 4) & 1);
                      auVar113._16_4_ = bVar46 * auVar112._16_4_ | (uint)!bVar46 * iVar31;
                      bVar46 = (bool)((byte)(uVar3 >> 5) & 1);
                      auVar113._20_4_ = bVar46 * auVar112._20_4_ | (uint)!bVar46 * iVar32;
                      bVar46 = (bool)((byte)(uVar3 >> 6) & 1);
                      auVar113._24_4_ = bVar46 * auVar112._24_4_ | (uint)!bVar46 * iVar33;
                      bVar46 = SUB81(uVar3 >> 7,0);
                      auVar113._28_4_ = bVar46 * auVar112._28_4_ | (uint)!bVar46 * iVar34;
                      auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xa0));
                      *(undefined1 (*) [32])(local_460.ray + 0x220) = auVar98;
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      uVar116 = bVar46 * uVar116 | (uint)!bVar46 * iVar117;
                      auVar26._4_24_ = auVar113._8_24_;
                      auVar26._0_4_ = uVar116;
                      auVar114._0_8_ = auVar26._0_8_ << 0x20;
                      bVar46 = (bool)((byte)(uVar3 >> 2) & 1);
                      auVar114._8_4_ = bVar46 * auVar113._8_4_ | (uint)!bVar46 * iVar29;
                      bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
                      auVar114._12_4_ = bVar46 * auVar113._12_4_ | (uint)!bVar46 * iVar30;
                      bVar46 = (bool)((byte)(uVar3 >> 4) & 1);
                      auVar114._16_4_ = bVar46 * auVar113._16_4_ | (uint)!bVar46 * iVar31;
                      bVar46 = (bool)((byte)(uVar3 >> 5) & 1);
                      auVar114._20_4_ = bVar46 * auVar113._20_4_ | (uint)!bVar46 * iVar32;
                      bVar46 = (bool)((byte)(uVar3 >> 6) & 1);
                      auVar114._24_4_ = bVar46 * auVar113._24_4_ | (uint)!bVar46 * iVar33;
                      bVar46 = SUB81(uVar3 >> 7,0);
                      auVar114._28_4_ = bVar46 * auVar113._28_4_ | (uint)!bVar46 * iVar34;
                      auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xc0));
                      *(undefined1 (*) [32])(local_460.ray + 0x240) = auVar98;
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      uVar116 = bVar46 * uVar116 | (uint)!bVar46 * iVar117;
                      auVar27._4_24_ = auVar114._8_24_;
                      auVar27._0_4_ = uVar116;
                      auVar115._0_8_ = auVar27._0_8_ << 0x20;
                      bVar46 = (bool)((byte)(uVar3 >> 2) & 1);
                      auVar115._8_4_ = bVar46 * auVar114._8_4_ | (uint)!bVar46 * iVar29;
                      bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
                      auVar115._12_4_ = bVar46 * auVar114._12_4_ | (uint)!bVar46 * iVar30;
                      bVar46 = (bool)((byte)(uVar3 >> 4) & 1);
                      auVar115._16_4_ = bVar46 * auVar114._16_4_ | (uint)!bVar46 * iVar31;
                      bVar46 = (bool)((byte)(uVar3 >> 5) & 1);
                      auVar115._20_4_ = bVar46 * auVar114._20_4_ | (uint)!bVar46 * iVar32;
                      bVar46 = (bool)((byte)(uVar3 >> 6) & 1);
                      auVar115._24_4_ = bVar46 * auVar114._24_4_ | (uint)!bVar46 * iVar33;
                      bVar46 = SUB81(uVar3 >> 7,0);
                      auVar115._28_4_ = bVar46 * auVar114._28_4_ | (uint)!bVar46 * iVar34;
                      auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xe0));
                      *(undefined1 (*) [32])(local_460.ray + 0x260) = auVar98;
                      bVar46 = (bool)((byte)(uVar3 >> 1) & 1);
                      auVar28._4_24_ = auVar115._8_24_;
                      auVar28._0_4_ = bVar46 * uVar116 | (uint)!bVar46 * iVar117;
                      auVar98._0_8_ = auVar28._0_8_ << 0x20;
                      bVar46 = (bool)((byte)(uVar3 >> 2) & 1);
                      auVar98._8_4_ = bVar46 * auVar115._8_4_ | (uint)!bVar46 * iVar29;
                      bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
                      auVar98._12_4_ = bVar46 * auVar115._12_4_ | (uint)!bVar46 * iVar30;
                      bVar46 = (bool)((byte)(uVar3 >> 4) & 1);
                      auVar98._16_4_ = bVar46 * auVar115._16_4_ | (uint)!bVar46 * iVar31;
                      bVar46 = (bool)((byte)(uVar3 >> 5) & 1);
                      auVar98._20_4_ = bVar46 * auVar115._20_4_ | (uint)!bVar46 * iVar32;
                      bVar46 = (bool)((byte)(uVar3 >> 6) & 1);
                      auVar98._24_4_ = bVar46 * auVar115._24_4_ | (uint)!bVar46 * iVar33;
                      bVar46 = SUB81(uVar3 >> 7,0);
                      auVar98._28_4_ = bVar46 * auVar115._28_4_ | (uint)!bVar46 * iVar34;
                      auVar94 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0x100));
                      *(undefined1 (*) [32])(local_460.ray + 0x280) = auVar94;
                      goto LAB_018fa3c0;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar238;
                }
              }
            }
          }
        }
      }
      goto LAB_018fa3c0;
    }
    auVar49 = vinsertps_avx(auVar67,auVar74,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }